

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  ulong uVar50;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar51;
  byte bVar52;
  byte bVar53;
  ulong uVar54;
  byte bVar55;
  undefined8 unaff_R13;
  ulong uVar56;
  bool bVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar130;
  uint uVar131;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar156;
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar157;
  vint4 bi_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar170 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar218;
  float fVar219;
  vint4 ai_2;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar220;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar207 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar215 [32];
  undefined1 auVar214 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar224;
  vint4 bi;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  vint4 ai;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [32];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  float fVar245;
  vint4 ai_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar244 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar262;
  undefined1 auVar257 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  float fVar261;
  undefined1 auVar258 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [64];
  float s;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_ae8;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  ulong local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  RTCHitN local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar116 [32];
  undefined1 auVar123 [32];
  undefined1 auVar126 [32];
  undefined1 auVar148 [32];
  undefined1 auVar259 [64];
  
  uVar50 = (ulong)(byte)prim[1];
  fVar224 = *(float *)(prim + uVar50 * 0x19 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar66 = vsubps_avx(auVar66,*(undefined1 (*) [16])(prim + uVar50 * 0x19 + 6));
  auVar198._0_4_ = fVar224 * auVar66._0_4_;
  auVar198._4_4_ = fVar224 * auVar66._4_4_;
  auVar198._8_4_ = fVar224 * auVar66._8_4_;
  auVar198._12_4_ = fVar224 * auVar66._12_4_;
  auVar71._0_4_ = fVar224 * auVar65._0_4_;
  auVar71._4_4_ = fVar224 * auVar65._4_4_;
  auVar71._8_4_ = fVar224 * auVar65._8_4_;
  auVar71._12_4_ = fVar224 * auVar65._12_4_;
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 4 + 6)));
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 6 + 6)));
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xb + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xc + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0xd + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x12 + 6)));
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x13 + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 * 0x14 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar271._4_4_ = auVar71._0_4_;
  auVar271._0_4_ = auVar71._0_4_;
  auVar271._8_4_ = auVar71._0_4_;
  auVar271._12_4_ = auVar71._0_4_;
  auVar69 = vshufps_avx(auVar71,auVar71,0x55);
  auVar70 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar224 = auVar70._0_4_;
  auVar225._0_4_ = fVar224 * auVar60._0_4_;
  fVar156 = auVar70._4_4_;
  auVar225._4_4_ = fVar156 * auVar60._4_4_;
  fVar197 = auVar70._8_4_;
  auVar225._8_4_ = fVar197 * auVar60._8_4_;
  fVar218 = auVar70._12_4_;
  auVar225._12_4_ = fVar218 * auVar60._12_4_;
  auVar158._0_4_ = auVar61._0_4_ * fVar224;
  auVar158._4_4_ = auVar61._4_4_ * fVar156;
  auVar158._8_4_ = auVar61._8_4_ * fVar197;
  auVar158._12_4_ = auVar61._12_4_ * fVar218;
  auVar137._0_4_ = auVar62._0_4_ * fVar224;
  auVar137._4_4_ = auVar62._4_4_ * fVar156;
  auVar137._8_4_ = auVar62._8_4_ * fVar197;
  auVar137._12_4_ = auVar62._12_4_ * fVar218;
  auVar70 = vfmadd231ps_fma(auVar225,auVar69,auVar65);
  auVar64 = vfmadd231ps_fma(auVar158,auVar69,auVar72);
  auVar69 = vfmadd231ps_fma(auVar137,auVar68,auVar69);
  auVar63 = vfmadd231ps_fma(auVar70,auVar271,auVar66);
  auVar64 = vfmadd231ps_fma(auVar64,auVar271,auVar67);
  auVar71 = vfmadd231ps_fma(auVar69,auVar265,auVar271);
  auVar272._4_4_ = auVar198._0_4_;
  auVar272._0_4_ = auVar198._0_4_;
  auVar272._8_4_ = auVar198._0_4_;
  auVar272._12_4_ = auVar198._0_4_;
  auVar69 = vshufps_avx(auVar198,auVar198,0x55);
  auVar70 = vshufps_avx(auVar198,auVar198,0xaa);
  auVar60 = vmulps_avx512vl(auVar70,auVar60);
  auVar199._0_4_ = auVar70._0_4_ * auVar61._0_4_;
  auVar199._4_4_ = auVar70._4_4_ * auVar61._4_4_;
  auVar199._8_4_ = auVar70._8_4_ * auVar61._8_4_;
  auVar199._12_4_ = auVar70._12_4_ * auVar61._12_4_;
  auVar177._0_4_ = auVar70._0_4_ * auVar62._0_4_;
  auVar177._4_4_ = auVar70._4_4_ * auVar62._4_4_;
  auVar177._8_4_ = auVar70._8_4_ * auVar62._8_4_;
  auVar177._12_4_ = auVar70._12_4_ * auVar62._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar60,auVar69,auVar65);
  auVar65 = vfmadd231ps_fma(auVar199,auVar69,auVar72);
  auVar60 = vfmadd231ps_fma(auVar177,auVar69,auVar68);
  auVar62 = vfmadd231ps_avx512vl(auVar61,auVar272,auVar66);
  auVar61 = vfmadd231ps_fma(auVar65,auVar272,auVar67);
  auVar68 = vfmadd231ps_fma(auVar60,auVar272,auVar265);
  auVar249._8_4_ = 0x7fffffff;
  auVar249._0_8_ = 0x7fffffff7fffffff;
  auVar249._12_4_ = 0x7fffffff;
  auVar66 = vandps_avx(auVar63,auVar249);
  auVar239._8_4_ = 0x219392ef;
  auVar239._0_8_ = 0x219392ef219392ef;
  auVar239._12_4_ = 0x219392ef;
  uVar56 = vcmpps_avx512vl(auVar66,auVar239,1);
  bVar57 = (bool)((byte)uVar56 & 1);
  auVar70._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._0_4_;
  bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._4_4_;
  bVar57 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._8_4_;
  bVar57 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar63._12_4_;
  auVar66 = vandps_avx(auVar64,auVar249);
  uVar56 = vcmpps_avx512vl(auVar66,auVar239,1);
  bVar57 = (bool)((byte)uVar56 & 1);
  auVar63._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._0_4_;
  bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._4_4_;
  bVar57 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._8_4_;
  bVar57 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar64._12_4_;
  auVar66 = vandps_avx(auVar71,auVar249);
  uVar56 = vcmpps_avx512vl(auVar66,auVar239,1);
  bVar57 = (bool)((byte)uVar56 & 1);
  auVar64._0_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._0_4_;
  bVar57 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._4_4_;
  bVar57 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._8_4_;
  bVar57 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar57 * 0x219392ef | (uint)!bVar57 * auVar71._12_4_;
  auVar65 = vrcp14ps_avx512vl(auVar70);
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = 0x3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar70,auVar65,auVar240);
  auVar60 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar63);
  auVar66 = vfnmadd213ps_fma(auVar63,auVar65,auVar240);
  auVar72 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar65 = vrcp14ps_avx512vl(auVar64);
  auVar66 = vfnmadd213ps_fma(auVar64,auVar65,auVar240);
  auVar265 = vfmadd132ps_fma(auVar66,auVar65,auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar50 * 7 + 6);
  auVar66 = vpmovsxwd_avx(auVar66);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar232._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar232._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar232._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar232._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar50 * 9 + 6);
  auVar66 = vpmovsxwd_avx(auVar65);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx512vl(auVar66,auVar62);
  auVar226._0_4_ = auVar60._0_4_ * auVar66._0_4_;
  auVar226._4_4_ = auVar60._4_4_ * auVar66._4_4_;
  auVar226._8_4_ = auVar60._8_4_ * auVar66._8_4_;
  auVar226._12_4_ = auVar60._12_4_ * auVar66._12_4_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar50 * 0xe + 6);
  auVar66 = vpmovsxwd_avx(auVar60);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar61);
  auVar241._0_4_ = auVar72._0_4_ * auVar66._0_4_;
  auVar241._4_4_ = auVar72._4_4_ * auVar66._4_4_;
  auVar241._8_4_ = auVar72._8_4_ * auVar66._8_4_;
  auVar241._12_4_ = auVar72._12_4_ * auVar66._12_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar67);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar61);
  auVar159._0_4_ = auVar72._0_4_ * auVar66._0_4_;
  auVar159._4_4_ = auVar72._4_4_ * auVar66._4_4_;
  auVar159._8_4_ = auVar72._8_4_ * auVar66._8_4_;
  auVar159._12_4_ = auVar72._12_4_ * auVar66._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar50 * 0x15 + 6);
  auVar66 = vpmovsxwd_avx(auVar72);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar200._0_4_ = auVar265._0_4_ * auVar66._0_4_;
  auVar200._4_4_ = auVar265._4_4_ * auVar66._4_4_;
  auVar200._8_4_ = auVar265._8_4_ * auVar66._8_4_;
  auVar200._12_4_ = auVar265._12_4_ * auVar66._12_4_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar50 * 0x17 + 6);
  auVar66 = vpmovsxwd_avx(auVar61);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar138._0_4_ = auVar265._0_4_ * auVar66._0_4_;
  auVar138._4_4_ = auVar265._4_4_ * auVar66._4_4_;
  auVar138._8_4_ = auVar265._8_4_ * auVar66._8_4_;
  auVar138._12_4_ = auVar265._12_4_ * auVar66._12_4_;
  auVar66 = vpminsd_avx(auVar232,auVar226);
  auVar65 = vpminsd_avx(auVar241,auVar159);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar65 = vpminsd_avx(auVar200,auVar138);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = uVar157;
  auVar265._0_4_ = uVar157;
  auVar265._8_4_ = uVar157;
  auVar265._12_4_ = uVar157;
  auVar65 = vmaxps_avx512vl(auVar65,auVar265);
  auVar66 = vmaxps_avx(auVar66,auVar65);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  local_540 = vmulps_avx512vl(auVar66,auVar68);
  auVar66 = vpmaxsd_avx(auVar232,auVar226);
  auVar65 = vpmaxsd_avx(auVar241,auVar159);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar65 = vpmaxsd_avx(auVar200,auVar138);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar62._4_4_ = uVar157;
  auVar62._0_4_ = uVar157;
  auVar62._8_4_ = uVar157;
  auVar62._12_4_ = uVar157;
  auVar65 = vminps_avx512vl(auVar65,auVar62);
  auVar66 = vminps_avx(auVar66,auVar65);
  auVar69._8_4_ = 0x3f800003;
  auVar69._0_8_ = 0x3f8000033f800003;
  auVar69._12_4_ = 0x3f800003;
  auVar66 = vmulps_avx512vl(auVar66,auVar69);
  auVar65 = vpbroadcastd_avx512vl();
  uVar12 = vcmpps_avx512vl(local_540,auVar66,2);
  uVar14 = vpcmpgtd_avx512vl(auVar65,_DAT_01f4ad30);
  uVar56 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar12 & 0xf & (byte)uVar14));
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_017f5489:
  if (uVar56 == 0) {
LAB_017f7e58:
    return uVar56 != 0;
  }
  lVar51 = 0;
  for (uVar50 = uVar56; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar51 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar51 = *(long *)&pGVar2[1].time_range.upper;
  auVar66 = *(undefined1 (*) [16])(lVar51 + (long)p_Var3 * uVar50);
  auVar65 = *(undefined1 (*) [16])(lVar51 + (uVar50 + 1) * (long)p_Var3);
  local_6a8 = uVar56 - 1 & uVar56;
  if (local_6a8 != 0) {
    uVar54 = local_6a8 - 1 & local_6a8;
    for (uVar58 = local_6a8; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
    }
    if (uVar54 != 0) {
      for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar60 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar67 = vinsertps_avx(auVar60,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar267._4_4_ = uVar157;
  auVar267._0_4_ = uVar157;
  auVar267._8_4_ = uVar157;
  auVar267._12_4_ = uVar157;
  local_5c0._16_4_ = uVar157;
  local_5c0._0_16_ = auVar267;
  local_5c0._20_4_ = uVar157;
  local_5c0._24_4_ = uVar157;
  local_5c0._28_4_ = uVar157;
  uVar157 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar273._4_4_ = uVar157;
  auVar273._0_4_ = uVar157;
  auVar273._8_4_ = uVar157;
  auVar273._12_4_ = uVar157;
  local_5e0._16_4_ = uVar157;
  local_5e0._0_16_ = auVar273;
  local_5e0._20_4_ = uVar157;
  local_5e0._24_4_ = uVar157;
  local_5e0._28_4_ = uVar157;
  auVar60 = vunpcklps_avx(auVar267,auVar273);
  fVar224 = *(float *)(ray + k * 4 + 0xc0);
  auVar274._4_4_ = fVar224;
  auVar274._0_4_ = fVar224;
  auVar274._8_4_ = fVar224;
  auVar274._12_4_ = fVar224;
  local_600._16_4_ = fVar224;
  local_600._0_16_ = auVar274;
  local_600._20_4_ = fVar224;
  local_600._24_4_ = fVar224;
  local_600._28_4_ = fVar224;
  local_7d0 = vinsertps_avx(auVar60,auVar274,0x28);
  auVar233._0_4_ = auVar66._0_4_ + auVar65._0_4_;
  auVar233._4_4_ = auVar66._4_4_ + auVar65._4_4_;
  auVar233._8_4_ = auVar66._8_4_ + auVar65._8_4_;
  auVar233._12_4_ = auVar66._12_4_ + auVar65._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar60 = vmulps_avx512vl(auVar233,auVar16);
  auVar60 = vsubps_avx(auVar60,auVar67);
  auVar60 = vdpps_avx(auVar60,local_7d0,0x7f);
  fVar156 = *(float *)(ray + k * 4 + 0x60);
  auVar264 = ZEXT464((uint)fVar156);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar266 = ZEXT1664(local_7e0);
  auVar242._4_12_ = ZEXT812(0) << 0x20;
  auVar242._0_4_ = local_7e0._0_4_;
  auVar61 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar242);
  auVar72 = vfnmadd213ss_fma(auVar61,local_7e0,ZEXT416(0x40000000));
  local_320 = auVar60._0_4_ * auVar61._0_4_ * auVar72._0_4_;
  auVar243._4_4_ = local_320;
  auVar243._0_4_ = local_320;
  auVar243._8_4_ = local_320;
  auVar243._12_4_ = local_320;
  fStack_590 = local_320;
  _local_5a0 = auVar243;
  fStack_58c = local_320;
  fStack_588 = local_320;
  fStack_584 = local_320;
  auVar60 = vfmadd231ps_fma(auVar67,local_7d0,auVar243);
  auVar60 = vblendps_avx(auVar60,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar60);
  auVar67 = vsubps_avx(*(undefined1 (*) [16])(lVar51 + (uVar50 + 2) * (long)p_Var3),auVar60);
  auVar253 = ZEXT1664(auVar67);
  auVar65 = vsubps_avx(auVar65,auVar60);
  auVar258 = ZEXT1664(auVar65);
  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar51 + (uVar50 + 3) * (long)p_Var3),auVar60);
  auVar73 = vbroadcastss_avx512vl(auVar66);
  auVar84._8_4_ = 1;
  auVar84._0_8_ = 0x100000001;
  auVar84._12_4_ = 1;
  auVar84._16_4_ = 1;
  auVar84._20_4_ = 1;
  auVar84._24_4_ = 1;
  auVar84._28_4_ = 1;
  local_760 = ZEXT1632(auVar66);
  auVar74 = vpermps_avx512vl(auVar84,local_760);
  auVar85._8_4_ = 2;
  auVar85._0_8_ = 0x200000002;
  auVar85._12_4_ = 2;
  auVar85._16_4_ = 2;
  auVar85._20_4_ = 2;
  auVar85._24_4_ = 2;
  auVar85._28_4_ = 2;
  auVar75 = vpermps_avx512vl(auVar85,local_760);
  auVar86._8_4_ = 3;
  auVar86._0_8_ = 0x300000003;
  auVar86._12_4_ = 3;
  auVar86._16_4_ = 3;
  auVar86._20_4_ = 3;
  auVar86._24_4_ = 3;
  auVar86._28_4_ = 3;
  auVar76 = vpermps_avx512vl(auVar86,local_760);
  auVar77 = vbroadcastss_avx512vl(auVar65);
  local_7a0 = ZEXT1632(auVar65);
  auVar78 = vpermps_avx512vl(auVar84,local_7a0);
  auVar79 = vpermps_avx512vl(auVar85,local_7a0);
  auVar80 = vpermps_avx512vl(auVar86,local_7a0);
  auVar81 = vbroadcastss_avx512vl(auVar67);
  local_780 = ZEXT1632(auVar67);
  auVar82 = vpermps_avx512vl(auVar84,local_780);
  local_280 = vpermps_avx512vl(auVar85,local_780);
  local_2a0 = vpermps_avx512vl(auVar86,local_780);
  local_260 = vbroadcastss_avx512vl(auVar60);
  _local_7c0 = ZEXT1632(auVar60);
  local_2e0 = vpermps_avx2(auVar84,_local_7c0);
  local_220 = vpermps_avx2(auVar85,_local_7c0);
  local_300 = vpermps_avx2(auVar86,_local_7c0);
  auVar66 = vfmadd231ps_fma(ZEXT432((uint)(fVar224 * fVar224)),local_5e0,local_5e0);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),local_5c0,local_5c0);
  local_240._0_4_ = auVar66._0_4_;
  local_240._4_4_ = local_240._0_4_;
  local_240._8_4_ = local_240._0_4_;
  local_240._12_4_ = local_240._0_4_;
  local_240._16_4_ = local_240._0_4_;
  local_240._20_4_ = local_240._0_4_;
  local_240._24_4_ = local_240._0_4_;
  local_240._28_4_ = local_240._0_4_;
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  auVar83._16_4_ = 0x7fffffff;
  auVar83._20_4_ = 0x7fffffff;
  auVar83._24_4_ = 0x7fffffff;
  auVar83._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_240,auVar83);
  local_6f0 = ZEXT416((uint)local_320);
  local_320 = fVar156 - local_320;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_4c0 = vpbroadcastd_avx512vl();
  uVar50 = 0;
  bVar49 = 0;
  local_ae8 = 1;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar66 = vsqrtss_avx(local_7e0,local_7e0);
  auVar65 = vsqrtss_avx(local_7e0,local_7e0);
  auVar175 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar238 = ZEXT3264(_DAT_01f7b040);
  local_2c0 = local_260;
  do {
    local_530 = auVar175._0_16_;
    auVar60 = vmovshdup_avx(local_530);
    auVar60 = vsubps_avx(auVar60,local_530);
    auVar139._0_4_ = auVar60._0_4_;
    fVar224 = auVar139._0_4_ * 0.04761905;
    uVar157 = auVar175._0_4_;
    auVar229._4_4_ = uVar157;
    auVar229._0_4_ = uVar157;
    auVar229._8_4_ = uVar157;
    auVar229._12_4_ = uVar157;
    auVar229._16_4_ = uVar157;
    auVar229._20_4_ = uVar157;
    auVar229._24_4_ = uVar157;
    auVar229._28_4_ = uVar157;
    auVar139._4_4_ = auVar139._0_4_;
    auVar139._8_4_ = auVar139._0_4_;
    auVar139._12_4_ = auVar139._0_4_;
    auVar148._16_4_ = auVar139._0_4_;
    auVar148._0_16_ = auVar139;
    auVar148._20_4_ = auVar139._0_4_;
    auVar148._24_4_ = auVar139._0_4_;
    auVar148._28_4_ = auVar139._0_4_;
    auVar60 = vfmadd231ps_fma(auVar229,auVar148,auVar238._0_32_);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar83 = vsubps_avx512vl(auVar83,ZEXT1632(auVar60));
    fVar197 = auVar60._0_4_;
    fVar218 = auVar60._4_4_;
    fVar219 = auVar60._8_4_;
    fVar220 = auVar60._12_4_;
    fVar222 = auVar83._0_4_;
    fVar223 = auVar83._4_4_;
    fVar245 = auVar83._8_4_;
    fVar246 = auVar83._12_4_;
    fVar247 = auVar83._16_4_;
    fVar176 = auVar83._20_4_;
    fVar248 = auVar83._24_4_;
    auVar88._4_4_ = fVar223 * fVar223 * -fVar218;
    auVar88._0_4_ = fVar222 * fVar222 * -fVar197;
    auVar88._8_4_ = fVar245 * fVar245 * -fVar219;
    auVar88._12_4_ = fVar246 * fVar246 * -fVar220;
    auVar88._16_4_ = fVar247 * fVar247 * -0.0;
    auVar88._20_4_ = fVar176 * fVar176 * -0.0;
    auVar88._24_4_ = fVar248 * fVar248 * -0.0;
    auVar88._28_4_ = 0x80000000;
    auVar253._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * fVar220,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar197 * fVar197)
                                    )));
    fVar254 = fVar197 * 3.0;
    fVar260 = fVar218 * 3.0;
    fVar261 = fVar219 * 3.0;
    fVar262 = fVar220 * 3.0;
    auVar259._28_36_ = auVar258._28_36_;
    auVar259._0_28_ = ZEXT1628(CONCAT412(fVar262,CONCAT48(fVar261,CONCAT44(fVar260,fVar254))));
    auVar238._0_4_ = (fVar254 + -5.0) * fVar197 * fVar197;
    auVar238._4_4_ = (fVar260 + -5.0) * fVar218 * fVar218;
    auVar238._8_4_ = (fVar261 + -5.0) * fVar219 * fVar219;
    auVar238._12_4_ = (fVar262 + -5.0) * fVar220 * fVar220;
    auVar238._16_4_ = 0x80000000;
    auVar238._20_4_ = 0x80000000;
    auVar238._28_36_ = auVar175._28_36_;
    auVar238._24_4_ = 0x80000000;
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar85 = vaddps_avx512vl(auVar238._0_32_,auVar84);
    auVar175._0_4_ = fVar222 * fVar222;
    auVar175._4_4_ = fVar223 * fVar223;
    auVar175._8_4_ = fVar245 * fVar245;
    auVar175._12_4_ = fVar246 * fVar246;
    auVar175._16_4_ = fVar247 * fVar247;
    auVar175._20_4_ = fVar176 * fVar176;
    auVar175._28_36_ = auVar264._28_36_;
    auVar175._24_4_ = fVar248 * fVar248;
    auVar91._4_4_ = auVar175._4_4_ * (fVar223 * 3.0 + -5.0);
    auVar91._0_4_ = auVar175._0_4_ * (fVar222 * 3.0 + -5.0);
    auVar91._8_4_ = auVar175._8_4_ * (fVar245 * 3.0 + -5.0);
    auVar91._12_4_ = auVar175._12_4_ * (fVar246 * 3.0 + -5.0);
    auVar91._16_4_ = auVar175._16_4_ * (fVar247 * 3.0 + -5.0);
    auVar91._20_4_ = auVar175._20_4_ * (fVar176 * 3.0 + -5.0);
    auVar91._24_4_ = auVar175._24_4_ * (fVar248 * 3.0 + -5.0);
    auVar91._28_4_ = auVar266._28_4_ + -5.0;
    auVar86 = vaddps_avx512vl(auVar91,auVar84);
    fVar221 = auVar83._28_4_;
    auVar92._4_4_ = fVar218 * fVar218 * -fVar223;
    auVar92._0_4_ = fVar197 * fVar197 * -fVar222;
    auVar92._8_4_ = fVar219 * fVar219 * -fVar245;
    auVar92._12_4_ = fVar220 * fVar220 * -fVar246;
    auVar92._16_4_ = -fVar247 * 0.0 * 0.0;
    auVar92._20_4_ = -fVar176 * 0.0 * 0.0;
    auVar92._24_4_ = -fVar248 * 0.0 * 0.0;
    auVar92._28_4_ = -fVar221;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar83 = vmulps_avx512vl(auVar88,auVar87);
    auVar88 = vmulps_avx512vl(auVar85,auVar87);
    auVar86 = vmulps_avx512vl(auVar86,auVar87);
    auVar89 = vmulps_avx512vl(auVar92,auVar87);
    auVar90 = vmulps_avx512vl(local_2c0,auVar89);
    auVar93._4_4_ = local_2e0._4_4_ * auVar89._4_4_;
    auVar93._0_4_ = local_2e0._0_4_ * auVar89._0_4_;
    auVar93._8_4_ = local_2e0._8_4_ * auVar89._8_4_;
    auVar93._12_4_ = local_2e0._12_4_ * auVar89._12_4_;
    auVar93._16_4_ = local_2e0._16_4_ * auVar89._16_4_;
    auVar93._20_4_ = local_2e0._20_4_ * auVar89._20_4_;
    auVar93._24_4_ = local_2e0._24_4_ * auVar89._24_4_;
    auVar93._28_4_ = auVar85._28_4_;
    auVar85 = vmulps_avx512vl(local_220,auVar89);
    auVar94._4_4_ = local_300._4_4_ * auVar89._4_4_;
    auVar94._0_4_ = local_300._0_4_ * auVar89._0_4_;
    auVar94._8_4_ = local_300._8_4_ * auVar89._8_4_;
    auVar94._12_4_ = local_300._12_4_ * auVar89._12_4_;
    auVar94._16_4_ = local_300._16_4_ * auVar89._16_4_;
    auVar94._20_4_ = local_300._20_4_ * auVar89._20_4_;
    auVar94._24_4_ = local_300._24_4_ * auVar89._24_4_;
    auVar94._28_4_ = auVar89._28_4_;
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar86,auVar81);
    auVar90 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar82);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,local_280);
    auVar86 = vfmadd231ps_avx512vl(auVar94,local_2a0,auVar86);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar77);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar78);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar79);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,auVar88);
    auVar91 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar73);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar83,auVar74);
    auVar93 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar75);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar76,auVar83);
    auVar95._4_4_ = (fVar223 + fVar223) * fVar218;
    auVar95._0_4_ = (fVar222 + fVar222) * fVar197;
    auVar95._8_4_ = (fVar245 + fVar245) * fVar219;
    auVar95._12_4_ = (fVar246 + fVar246) * fVar220;
    auVar95._16_4_ = (fVar247 + fVar247) * 0.0;
    auVar95._20_4_ = (fVar176 + fVar176) * 0.0;
    auVar95._24_4_ = (fVar248 + fVar248) * 0.0;
    auVar95._28_4_ = auVar88._28_4_;
    auVar83 = vsubps_avx(auVar95,auVar175._0_32_);
    auVar105._0_28_ =
         ZEXT1628(CONCAT412((fVar220 + fVar220) * (fVar262 + -5.0) + fVar262 * fVar220,
                            CONCAT48((fVar219 + fVar219) * (fVar261 + -5.0) + fVar261 * fVar219,
                                     CONCAT44((fVar218 + fVar218) * (fVar260 + -5.0) +
                                              fVar260 * fVar218,
                                              (fVar197 + fVar197) * (fVar254 + -5.0) +
                                              fVar254 * fVar197))));
    auVar105._28_4_ = auVar258._28_4_ + -5.0 + 0.0;
    auVar84 = vaddps_avx512vl(auVar259._0_32_,auVar84);
    auVar96._4_4_ = (fVar223 + fVar223) * auVar84._4_4_;
    auVar96._0_4_ = (fVar222 + fVar222) * auVar84._0_4_;
    auVar96._8_4_ = (fVar245 + fVar245) * auVar84._8_4_;
    auVar96._12_4_ = (fVar246 + fVar246) * auVar84._12_4_;
    auVar96._16_4_ = (fVar247 + fVar247) * auVar84._16_4_;
    auVar96._20_4_ = (fVar176 + fVar176) * auVar84._20_4_;
    auVar96._24_4_ = (fVar248 + fVar248) * auVar84._24_4_;
    auVar96._28_4_ = auVar84._28_4_;
    auVar97._4_4_ = fVar223 * 3.0 * fVar223;
    auVar97._0_4_ = fVar222 * 3.0 * fVar222;
    auVar97._8_4_ = fVar245 * 3.0 * fVar245;
    auVar97._12_4_ = fVar246 * 3.0 * fVar246;
    auVar97._16_4_ = fVar247 * 3.0 * fVar247;
    auVar97._20_4_ = fVar176 * 3.0 * fVar176;
    auVar97._24_4_ = fVar248 * 3.0 * fVar248;
    auVar97._28_4_ = fVar221;
    auVar84 = vsubps_avx(auVar96,auVar97);
    auVar85 = vsubps_avx(auVar253._0_32_,auVar95);
    auVar89 = vmulps_avx512vl(auVar83,auVar87);
    auVar90 = vmulps_avx512vl(auVar105,auVar87);
    auVar84 = vmulps_avx512vl(auVar84,auVar87);
    auVar85 = vmulps_avx512vl(auVar85,auVar87);
    auVar87 = vmulps_avx512vl(local_2c0,auVar85);
    auVar98._4_4_ = local_2e0._4_4_ * auVar85._4_4_;
    auVar98._0_4_ = local_2e0._0_4_ * auVar85._0_4_;
    auVar98._8_4_ = local_2e0._8_4_ * auVar85._8_4_;
    auVar98._12_4_ = local_2e0._12_4_ * auVar85._12_4_;
    auVar98._16_4_ = local_2e0._16_4_ * auVar85._16_4_;
    auVar98._20_4_ = local_2e0._20_4_ * auVar85._20_4_;
    auVar98._24_4_ = local_2e0._24_4_ * auVar85._24_4_;
    auVar98._28_4_ = auVar83._28_4_;
    auVar83 = vmulps_avx512vl(local_220,auVar85);
    auVar99._4_4_ = local_300._4_4_ * auVar85._4_4_;
    auVar99._0_4_ = local_300._0_4_ * auVar85._0_4_;
    auVar99._8_4_ = local_300._8_4_ * auVar85._8_4_;
    auVar99._12_4_ = local_300._12_4_ * auVar85._12_4_;
    auVar99._16_4_ = local_300._16_4_ * auVar85._16_4_;
    auVar99._20_4_ = local_300._20_4_ * auVar85._20_4_;
    auVar99._24_4_ = local_300._24_4_ * auVar85._24_4_;
    auVar99._28_4_ = auVar85._28_4_;
    auVar85 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar81);
    auVar87 = vfmadd231ps_avx512vl(auVar98,auVar84,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar84,local_280);
    auVar84 = vfmadd231ps_avx512vl(auVar99,local_2a0,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar90,auVar77);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,auVar78);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar90,auVar79);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar80,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,auVar73);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar74);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar75);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar76,auVar89);
    auVar112._4_4_ = auVar85._4_4_ * fVar224;
    auVar112._0_4_ = auVar85._0_4_ * fVar224;
    auVar112._8_4_ = auVar85._8_4_ * fVar224;
    auVar112._12_4_ = auVar85._12_4_ * fVar224;
    auVar112._16_4_ = auVar85._16_4_ * fVar224;
    auVar112._20_4_ = auVar85._20_4_ * fVar224;
    auVar112._24_4_ = auVar85._24_4_ * fVar224;
    auVar112._28_4_ = fVar221 + fVar221;
    auVar113._4_4_ = auVar87._4_4_ * fVar224;
    auVar113._0_4_ = auVar87._0_4_ * fVar224;
    auVar113._8_4_ = auVar87._8_4_ * fVar224;
    auVar113._12_4_ = auVar87._12_4_ * fVar224;
    auVar113._16_4_ = auVar87._16_4_ * fVar224;
    auVar113._20_4_ = auVar87._20_4_ * fVar224;
    auVar113._24_4_ = auVar87._24_4_ * fVar224;
    auVar113._28_4_ = auVar88._28_4_;
    auVar114._4_4_ = auVar83._4_4_ * fVar224;
    auVar114._0_4_ = auVar83._0_4_ * fVar224;
    auVar114._8_4_ = auVar83._8_4_ * fVar224;
    auVar114._12_4_ = auVar83._12_4_ * fVar224;
    auVar114._16_4_ = auVar83._16_4_ * fVar224;
    auVar114._20_4_ = auVar83._20_4_ * fVar224;
    auVar114._24_4_ = auVar83._24_4_ * fVar224;
    auVar114._28_4_ = 0;
    fVar197 = fVar224 * auVar84._0_4_;
    fVar218 = fVar224 * auVar84._4_4_;
    auVar103._4_4_ = fVar218;
    auVar103._0_4_ = fVar197;
    fVar219 = fVar224 * auVar84._8_4_;
    auVar103._8_4_ = fVar219;
    fVar220 = fVar224 * auVar84._12_4_;
    auVar103._12_4_ = fVar220;
    fVar221 = fVar224 * auVar84._16_4_;
    auVar103._16_4_ = fVar221;
    fVar222 = fVar224 * auVar84._20_4_;
    auVar103._20_4_ = fVar222;
    fVar223 = fVar224 * auVar84._24_4_;
    auVar103._24_4_ = fVar223;
    auVar103._28_4_ = fVar224;
    auVar60 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar95 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar264 = ZEXT3264(auVar95);
    auVar85 = ZEXT1632(auVar60);
    auVar96 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar85);
    auVar266 = ZEXT3264(auVar96);
    auVar106._0_4_ = auVar86._0_4_ + fVar197;
    auVar106._4_4_ = auVar86._4_4_ + fVar218;
    auVar106._8_4_ = auVar86._8_4_ + fVar219;
    auVar106._12_4_ = auVar86._12_4_ + fVar220;
    auVar106._16_4_ = auVar86._16_4_ + fVar221;
    auVar106._20_4_ = auVar86._20_4_ + fVar222;
    auVar106._24_4_ = auVar86._24_4_ + fVar223;
    auVar106._28_4_ = auVar86._28_4_ + fVar224;
    auVar83 = vmaxps_avx(auVar86,auVar106);
    auVar84 = vminps_avx(auVar86,auVar106);
    auVar89 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar85);
    auVar97 = vpermt2ps_avx512vl(auVar112,_DAT_01fb9fc0,auVar85);
    auVar98 = vpermt2ps_avx512vl(auVar113,_DAT_01fb9fc0,auVar85);
    auVar108 = ZEXT1632(auVar60);
    auVar99 = vpermt2ps_avx512vl(auVar114,_DAT_01fb9fc0,auVar108);
    auVar85 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar108);
    auVar90 = vsubps_avx512vl(auVar89,auVar85);
    auVar85 = vsubps_avx(auVar94,auVar91);
    auVar258 = ZEXT3264(auVar85);
    auVar86 = vsubps_avx(auVar95,auVar92);
    auVar253 = ZEXT3264(auVar86);
    auVar88 = vsubps_avx(auVar96,auVar93);
    auVar87 = vmulps_avx512vl(auVar86,auVar114);
    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar113,auVar88);
    auVar100 = vmulps_avx512vl(auVar88,auVar112);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar114,auVar85);
    auVar101 = vmulps_avx512vl(auVar85,auVar113);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar112,auVar86);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar87);
    auVar87 = vmulps_avx512vl(auVar88,auVar88);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar85);
    auVar102 = vrcp14ps_avx512vl(auVar101);
    auVar87._8_4_ = 0x3f800000;
    auVar87._0_8_ = 0x3f8000003f800000;
    auVar87._12_4_ = 0x3f800000;
    auVar87._16_4_ = 0x3f800000;
    auVar87._20_4_ = 0x3f800000;
    auVar87._24_4_ = 0x3f800000;
    auVar87._28_4_ = 0x3f800000;
    auVar87 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar87);
    auVar87 = vfmadd132ps_avx512vl(auVar87,auVar102,auVar102);
    auVar100 = vmulps_avx512vl(auVar100,auVar87);
    auVar102 = vmulps_avx512vl(auVar86,auVar99);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar98,auVar88);
    auVar103 = vmulps_avx512vl(auVar88,auVar97);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar99,auVar85);
    auVar104 = vmulps_avx512vl(auVar85,auVar98);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar97,auVar86);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar87 = vmulps_avx512vl(auVar102,auVar87);
    auVar87 = vmaxps_avx512vl(auVar100,auVar87);
    auVar87 = vsqrtps_avx512vl(auVar87);
    auVar100 = vmaxps_avx512vl(auVar90,auVar89);
    auVar83 = vmaxps_avx512vl(auVar83,auVar100);
    auVar102 = vaddps_avx512vl(auVar87,auVar83);
    auVar83 = vminps_avx512vl(auVar90,auVar89);
    auVar83 = vminps_avx(auVar84,auVar83);
    auVar83 = vsubps_avx512vl(auVar83,auVar87);
    auVar89._8_4_ = 0x3f800002;
    auVar89._0_8_ = 0x3f8000023f800002;
    auVar89._12_4_ = 0x3f800002;
    auVar89._16_4_ = 0x3f800002;
    auVar89._20_4_ = 0x3f800002;
    auVar89._24_4_ = 0x3f800002;
    auVar89._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar102,auVar89);
    auVar90._8_4_ = 0x3f7ffffc;
    auVar90._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar90._12_4_ = 0x3f7ffffc;
    auVar90._16_4_ = 0x3f7ffffc;
    auVar90._20_4_ = 0x3f7ffffc;
    auVar90._24_4_ = 0x3f7ffffc;
    auVar90._28_4_ = 0x3f7ffffc;
    auVar83 = vmulps_avx512vl(auVar83,auVar90);
    auVar84 = vmulps_avx512vl(auVar84,auVar84);
    auVar87 = vrsqrt14ps_avx512vl(auVar101);
    auVar100._8_4_ = 0xbf000000;
    auVar100._0_8_ = 0xbf000000bf000000;
    auVar100._12_4_ = 0xbf000000;
    auVar100._16_4_ = 0xbf000000;
    auVar100._20_4_ = 0xbf000000;
    auVar100._24_4_ = 0xbf000000;
    auVar100._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar101,auVar100);
    fVar224 = auVar87._0_4_;
    fVar197 = auVar87._4_4_;
    fVar218 = auVar87._8_4_;
    fVar219 = auVar87._12_4_;
    fVar220 = auVar87._16_4_;
    fVar221 = auVar87._20_4_;
    fVar222 = auVar87._24_4_;
    auVar104._4_4_ = fVar197 * fVar197 * fVar197 * auVar89._4_4_;
    auVar104._0_4_ = fVar224 * fVar224 * fVar224 * auVar89._0_4_;
    auVar104._8_4_ = fVar218 * fVar218 * fVar218 * auVar89._8_4_;
    auVar104._12_4_ = fVar219 * fVar219 * fVar219 * auVar89._12_4_;
    auVar104._16_4_ = fVar220 * fVar220 * fVar220 * auVar89._16_4_;
    auVar104._20_4_ = fVar221 * fVar221 * fVar221 * auVar89._20_4_;
    auVar104._24_4_ = fVar222 * fVar222 * fVar222 * auVar89._24_4_;
    auVar104._28_4_ = auVar102._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar87 = vfmadd231ps_avx512vl(auVar104,auVar87,auVar101);
    auVar89 = vmulps_avx512vl(auVar85,auVar87);
    auVar90 = vmulps_avx512vl(auVar86,auVar87);
    auVar100 = vmulps_avx512vl(auVar88,auVar87);
    auVar101 = vsubps_avx512vl(auVar108,auVar91);
    auVar103 = vsubps_avx512vl(auVar108,auVar92);
    auVar104 = vsubps_avx512vl(auVar108,auVar93);
    auVar102 = vmulps_avx512vl(local_600,auVar104);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_5e0,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar102,local_5c0,auVar101);
    auVar105 = vmulps_avx512vl(auVar104,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar106 = vmulps_avx512vl(local_600,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar90,local_5e0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar89,local_5c0);
    auVar100 = vmulps_avx512vl(auVar104,auVar100);
    auVar90 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar89);
    auVar90 = vmulps_avx512vl(auVar106,auVar106);
    auVar100 = vsubps_avx512vl(local_240,auVar90);
    auVar107 = vmulps_avx512vl(auVar106,auVar89);
    auVar102 = vsubps_avx512vl(auVar102,auVar107);
    auVar107 = vaddps_avx512vl(auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar89,auVar89);
    local_740 = vsubps_avx512vl(auVar105,auVar102);
    auVar84 = vsubps_avx512vl(local_740,auVar84);
    auVar105 = vmulps_avx512vl(auVar107,auVar107);
    auVar102._8_4_ = 0x40800000;
    auVar102._0_8_ = 0x4080000040800000;
    auVar102._12_4_ = 0x40800000;
    auVar102._16_4_ = 0x40800000;
    auVar102._20_4_ = 0x40800000;
    auVar102._24_4_ = 0x40800000;
    auVar102._28_4_ = 0x40800000;
    _local_620 = vmulps_avx512vl(auVar100,auVar102);
    auVar102 = vmulps_avx512vl(_local_620,auVar84);
    auVar102 = vsubps_avx512vl(auVar105,auVar102);
    uVar58 = vcmpps_avx512vl(auVar102,auVar108,5);
    bVar46 = (byte)uVar58;
    if (bVar46 == 0) {
LAB_017f61d3:
      auVar238 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar102 = vsqrtps_avx512vl(auVar102);
      local_640 = vaddps_avx512vl(auVar100,auVar100);
      local_660 = vrcp14ps_avx512vl(local_640);
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar108 = vfnmadd213ps_avx512vl(local_660,local_640,auVar108);
      auVar108 = vfmadd132ps_avx512vl(auVar108,local_660,local_660);
      auVar109._8_4_ = 0x80000000;
      auVar109._0_8_ = 0x8000000080000000;
      auVar109._12_4_ = 0x80000000;
      auVar109._16_4_ = 0x80000000;
      auVar109._20_4_ = 0x80000000;
      auVar109._24_4_ = 0x80000000;
      auVar109._28_4_ = 0x80000000;
      local_680 = vxorps_avx512vl(auVar107,auVar109);
      auVar109 = vsubps_avx512vl(local_680,auVar102);
      auVar109 = vmulps_avx512vl(auVar109,auVar108);
      auVar102 = vsubps_avx512vl(auVar102,auVar107);
      local_800 = vmulps_avx512vl(auVar102,auVar108);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar108 = vblendmps_avx512vl(auVar102,auVar109);
      auVar110._0_4_ =
           (uint)(bVar46 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar102._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar57 * auVar108._4_4_ | (uint)!bVar57 * auVar102._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar57 * auVar108._8_4_ | (uint)!bVar57 * auVar102._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar57 * auVar108._12_4_ | (uint)!bVar57 * auVar102._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar57 * auVar108._16_4_ | (uint)!bVar57 * auVar102._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar57 * auVar108._20_4_ | (uint)!bVar57 * auVar102._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar57 * auVar108._24_4_ | (uint)!bVar57 * auVar102._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar110._28_4_ = (uint)bVar57 * auVar108._28_4_ | (uint)!bVar57 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar108 = vblendmps_avx512vl(auVar102,local_800);
      auVar111._0_4_ =
           (uint)(bVar46 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar102._0_4_;
      bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar57 * auVar108._4_4_ | (uint)!bVar57 * auVar102._4_4_;
      bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar57 * auVar108._8_4_ | (uint)!bVar57 * auVar102._8_4_;
      bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar57 * auVar108._12_4_ | (uint)!bVar57 * auVar102._12_4_;
      bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar57 * auVar108._16_4_ | (uint)!bVar57 * auVar102._16_4_;
      bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar57 * auVar108._20_4_ | (uint)!bVar57 * auVar102._20_4_;
      bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar57 * auVar108._24_4_ | (uint)!bVar57 * auVar102._24_4_;
      bVar57 = SUB81(uVar58 >> 7,0);
      auVar111._28_4_ = (uint)bVar57 * auVar108._28_4_ | (uint)!bVar57 * auVar102._28_4_;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar90,auVar102);
      local_820 = vmaxps_avx512vl(local_260,auVar102);
      auVar115._8_4_ = 0x36000000;
      auVar115._0_8_ = 0x3600000036000000;
      auVar115._12_4_ = 0x36000000;
      auVar115._16_4_ = 0x36000000;
      auVar115._20_4_ = 0x36000000;
      auVar115._24_4_ = 0x36000000;
      auVar115._28_4_ = 0x36000000;
      local_6a0 = vmulps_avx512vl(local_820,auVar115);
      vandps_avx512vl(auVar100,auVar102);
      uVar54 = vcmpps_avx512vl(local_6a0,local_6a0,1);
      uVar58 = uVar58 & uVar54;
      bVar53 = (byte)uVar58;
      if (bVar53 != 0) {
        uVar54 = vcmpps_avx512vl(auVar84,_DAT_01f7b000,2);
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar100 = vblendmps_avx512vl(auVar84,auVar90);
        bVar52 = (byte)uVar54;
        uVar59 = (uint)(bVar52 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar52 & 1) * local_6a0._0_4_;
        bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
        uVar130 = (uint)bVar57 * auVar100._4_4_ | (uint)!bVar57 * local_6a0._4_4_;
        bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
        uVar131 = (uint)bVar57 * auVar100._8_4_ | (uint)!bVar57 * local_6a0._8_4_;
        bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
        uVar132 = (uint)bVar57 * auVar100._12_4_ | (uint)!bVar57 * local_6a0._12_4_;
        bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
        uVar133 = (uint)bVar57 * auVar100._16_4_ | (uint)!bVar57 * local_6a0._16_4_;
        bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
        uVar134 = (uint)bVar57 * auVar100._20_4_ | (uint)!bVar57 * local_6a0._20_4_;
        bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
        uVar135 = (uint)bVar57 * auVar100._24_4_ | (uint)!bVar57 * local_6a0._24_4_;
        bVar57 = SUB81(uVar54 >> 7,0);
        uVar136 = (uint)bVar57 * auVar100._28_4_ | (uint)!bVar57 * local_6a0._28_4_;
        auVar110._0_4_ = (bVar53 & 1) * uVar59 | !(bool)(bVar53 & 1) * auVar110._0_4_;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar110._4_4_ = bVar57 * uVar130 | !bVar57 * auVar110._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar110._8_4_ = bVar57 * uVar131 | !bVar57 * auVar110._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar110._12_4_ = bVar57 * uVar132 | !bVar57 * auVar110._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar110._16_4_ = bVar57 * uVar133 | !bVar57 * auVar110._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar110._20_4_ = bVar57 * uVar134 | !bVar57 * auVar110._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar110._24_4_ = bVar57 * uVar135 | !bVar57 * auVar110._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar110._28_4_ = bVar57 * uVar136 | !bVar57 * auVar110._28_4_;
        auVar84 = vblendmps_avx512vl(auVar90,auVar84);
        bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
        bVar10 = SUB81(uVar54 >> 7,0);
        auVar111._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar52 & 1) * auVar84._0_4_ | !(bool)(bVar52 & 1) * uVar59) |
             !(bool)(bVar53 & 1) * auVar111._0_4_;
        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar111._4_4_ =
             (uint)bVar4 * ((uint)bVar57 * auVar84._4_4_ | !bVar57 * uVar130) |
             !bVar4 * auVar111._4_4_;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar111._8_4_ =
             (uint)bVar57 * ((uint)bVar5 * auVar84._8_4_ | !bVar5 * uVar131) |
             !bVar57 * auVar111._8_4_;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar111._12_4_ =
             (uint)bVar57 * ((uint)bVar6 * auVar84._12_4_ | !bVar6 * uVar132) |
             !bVar57 * auVar111._12_4_;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar111._16_4_ =
             (uint)bVar57 * ((uint)bVar7 * auVar84._16_4_ | !bVar7 * uVar133) |
             !bVar57 * auVar111._16_4_;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar111._20_4_ =
             (uint)bVar57 * ((uint)bVar8 * auVar84._20_4_ | !bVar8 * uVar134) |
             !bVar57 * auVar111._20_4_;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar111._24_4_ =
             (uint)bVar57 * ((uint)bVar9 * auVar84._24_4_ | !bVar9 * uVar135) |
             !bVar57 * auVar111._24_4_;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar111._28_4_ =
             (uint)bVar57 * ((uint)bVar10 * auVar84._28_4_ | !bVar10 * uVar136) |
             !bVar57 * auVar111._28_4_;
        bVar46 = (~bVar53 | bVar52) & bVar46;
      }
      if ((bVar46 & 0x7f) == 0) goto LAB_017f61d3;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar99 = vxorps_avx512vl(auVar99,auVar102);
      auVar97 = vxorps_avx512vl(auVar97,auVar102);
      auVar175 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar98 = vxorps_avx512vl(auVar98,auVar102);
      auVar60 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_6f0._0_4_));
      auVar84 = vbroadcastss_avx512vl(auVar60);
      auVar84 = vminps_avx512vl(auVar84,auVar111);
      auVar45._4_4_ = fStack_31c;
      auVar45._0_4_ = local_320;
      auVar45._8_4_ = fStack_318;
      auVar45._12_4_ = fStack_314;
      auVar45._16_4_ = fStack_310;
      auVar45._20_4_ = fStack_30c;
      auVar45._24_4_ = fStack_308;
      auVar45._28_4_ = fStack_304;
      auVar90 = vmaxps_avx512vl(auVar45,auVar110);
      auVar100 = vmulps_avx512vl(auVar104,auVar114);
      auVar100 = vfmadd213ps_avx512vl(auVar103,auVar113,auVar100);
      auVar60 = vfmadd213ps_fma(auVar101,auVar112,auVar100);
      auVar100 = vmulps_avx512vl(local_600,auVar114);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_5e0,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_5c0,auVar112);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar100,auVar101);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar101,auVar112,1);
      auVar113 = vxorps_avx512vl(ZEXT1632(auVar60),auVar102);
      auVar114 = vrcp14ps_avx512vl(auVar100);
      auVar103 = vxorps_avx512vl(auVar100,auVar102);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar108 = vfnmadd213ps_avx512vl(auVar114,auVar100,auVar104);
      auVar60 = vfmadd132ps_fma(auVar108,auVar114,auVar114);
      fVar224 = auVar60._0_4_ * auVar113._0_4_;
      fVar197 = auVar60._4_4_ * auVar113._4_4_;
      auVar30._4_4_ = fVar197;
      auVar30._0_4_ = fVar224;
      fVar218 = auVar60._8_4_ * auVar113._8_4_;
      auVar30._8_4_ = fVar218;
      fVar219 = auVar60._12_4_ * auVar113._12_4_;
      auVar30._12_4_ = fVar219;
      fVar220 = auVar113._16_4_ * 0.0;
      auVar30._16_4_ = fVar220;
      fVar221 = auVar113._20_4_ * 0.0;
      auVar30._20_4_ = fVar221;
      fVar222 = auVar113._24_4_ * 0.0;
      auVar30._24_4_ = fVar222;
      auVar30._28_4_ = auVar113._28_4_;
      uVar14 = vcmpps_avx512vl(auVar100,auVar103,1);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar30,auVar108);
      auVar116._0_4_ =
           (uint)(bVar53 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar114._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar57 * auVar115._4_4_ | (uint)!bVar57 * auVar114._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar57 * auVar115._8_4_ | (uint)!bVar57 * auVar114._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar57 * auVar115._12_4_ | (uint)!bVar57 * auVar114._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar57 * auVar115._16_4_ | (uint)!bVar57 * auVar114._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar57 * auVar115._20_4_ | (uint)!bVar57 * auVar114._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar57 * auVar115._24_4_ | (uint)!bVar57 * auVar114._24_4_;
      auVar116._28_4_ =
           (uint)(bVar53 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar114._28_4_;
      auVar114 = vmaxps_avx512vl(auVar90,auVar116);
      uVar14 = vcmpps_avx512vl(auVar100,auVar103,6);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117._0_4_ =
           (uint)(bVar53 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)fVar224;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar57 * auVar103._4_4_ | (uint)!bVar57 * (int)fVar197;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar57 * auVar103._8_4_ | (uint)!bVar57 * (int)fVar218;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar57 * auVar103._12_4_ | (uint)!bVar57 * (int)fVar219;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar57 * auVar103._16_4_ | (uint)!bVar57 * (int)fVar220;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar57 * auVar103._20_4_ | (uint)!bVar57 * (int)fVar221;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar57 * auVar103._24_4_ | (uint)!bVar57 * (int)fVar222;
      auVar117._28_4_ =
           (uint)(bVar53 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar113._28_4_;
      auVar113 = vminps_avx512vl(auVar84,auVar117);
      auVar84 = vsubps_avx(ZEXT832(0) << 0x20,auVar94);
      auVar90 = vsubps_avx(ZEXT832(0) << 0x20,auVar95);
      auVar94 = ZEXT832(0) << 0x20;
      auVar100 = vsubps_avx(auVar94,auVar96);
      auVar100 = vmulps_avx512vl(auVar100,auVar99);
      auVar90 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar90);
      auVar84 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar84);
      auVar90 = vmulps_avx512vl(local_600,auVar99);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_5e0,auVar98);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_5c0,auVar97);
      vandps_avx512vl(auVar90,auVar101);
      uVar12 = vcmpps_avx512vl(auVar90,auVar112,1);
      auVar100 = vxorps_avx512vl(auVar84,auVar102);
      auVar84 = vrcp14ps_avx512vl(auVar90);
      auVar101 = vxorps_avx512vl(auVar90,auVar102);
      auVar266 = ZEXT3264(auVar101);
      auVar102 = vfnmadd213ps_avx512vl(auVar84,auVar90,auVar104);
      auVar60 = vfmadd132ps_fma(auVar102,auVar84,auVar84);
      fVar224 = auVar60._0_4_ * auVar100._0_4_;
      fVar197 = auVar60._4_4_ * auVar100._4_4_;
      auVar31._4_4_ = fVar197;
      auVar31._0_4_ = fVar224;
      fVar218 = auVar60._8_4_ * auVar100._8_4_;
      auVar31._8_4_ = fVar218;
      fVar219 = auVar60._12_4_ * auVar100._12_4_;
      auVar31._12_4_ = fVar219;
      fVar220 = auVar100._16_4_ * 0.0;
      auVar31._16_4_ = fVar220;
      fVar221 = auVar100._20_4_ * 0.0;
      auVar31._20_4_ = fVar221;
      fVar222 = auVar100._24_4_ * 0.0;
      auVar31._24_4_ = fVar222;
      auVar31._28_4_ = auVar100._28_4_;
      uVar14 = vcmpps_avx512vl(auVar90,auVar101,1);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar102 = vblendmps_avx512vl(auVar31,auVar108);
      auVar118._0_4_ =
           (uint)(bVar53 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar84._0_4_;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar57 * auVar102._4_4_ | (uint)!bVar57 * auVar84._4_4_;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar57 * auVar102._8_4_ | (uint)!bVar57 * auVar84._8_4_;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar57 * auVar102._12_4_ | (uint)!bVar57 * auVar84._12_4_;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar57 * auVar102._16_4_ | (uint)!bVar57 * auVar84._16_4_;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar57 * auVar102._20_4_ | (uint)!bVar57 * auVar84._20_4_;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar57 * auVar102._24_4_ | (uint)!bVar57 * auVar84._24_4_;
      auVar118._28_4_ =
           (uint)(bVar53 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar84._28_4_;
      auVar84 = vmaxps_avx(auVar114,auVar118);
      auVar264 = ZEXT3264(auVar84);
      uVar14 = vcmpps_avx512vl(auVar90,auVar101,6);
      bVar53 = (byte)uVar12 | (byte)uVar14;
      auVar119._0_4_ =
           (uint)(bVar53 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)fVar224;
      bVar57 = (bool)(bVar53 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar57 * auVar103._4_4_ | (uint)!bVar57 * (int)fVar197;
      bVar57 = (bool)(bVar53 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar57 * auVar103._8_4_ | (uint)!bVar57 * (int)fVar218;
      bVar57 = (bool)(bVar53 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar57 * auVar103._12_4_ | (uint)!bVar57 * (int)fVar219;
      bVar57 = (bool)(bVar53 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar57 * auVar103._16_4_ | (uint)!bVar57 * (int)fVar220;
      bVar57 = (bool)(bVar53 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar57 * auVar103._20_4_ | (uint)!bVar57 * (int)fVar221;
      bVar57 = (bool)(bVar53 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar57 * auVar103._24_4_ | (uint)!bVar57 * (int)fVar222;
      auVar119._28_4_ =
           (uint)(bVar53 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar100._28_4_;
      local_360 = vminps_avx(auVar113,auVar119);
      uVar12 = vcmpps_avx512vl(auVar84,local_360,2);
      bVar46 = bVar46 & 0x7f & (byte)uVar12;
      if (bVar46 == 0) goto LAB_017f61d3;
      auVar83 = vmaxps_avx(auVar94,auVar83);
      auVar90 = vfmadd213ps_avx512vl(auVar109,auVar106,auVar89);
      fVar224 = auVar87._0_4_;
      fVar197 = auVar87._4_4_;
      auVar32._4_4_ = fVar197 * auVar90._4_4_;
      auVar32._0_4_ = fVar224 * auVar90._0_4_;
      fVar218 = auVar87._8_4_;
      auVar32._8_4_ = fVar218 * auVar90._8_4_;
      fVar219 = auVar87._12_4_;
      auVar32._12_4_ = fVar219 * auVar90._12_4_;
      fVar220 = auVar87._16_4_;
      auVar32._16_4_ = fVar220 * auVar90._16_4_;
      fVar221 = auVar87._20_4_;
      auVar32._20_4_ = fVar221 * auVar90._20_4_;
      fVar222 = auVar87._24_4_;
      auVar32._24_4_ = fVar222 * auVar90._24_4_;
      auVar32._28_4_ = auVar90._28_4_;
      auVar90 = vfmadd213ps_avx512vl(local_800,auVar106,auVar89);
      auVar33._4_4_ = fVar197 * auVar90._4_4_;
      auVar33._0_4_ = fVar224 * auVar90._0_4_;
      auVar33._8_4_ = fVar218 * auVar90._8_4_;
      auVar33._12_4_ = fVar219 * auVar90._12_4_;
      auVar33._16_4_ = fVar220 * auVar90._16_4_;
      auVar33._20_4_ = fVar221 * auVar90._20_4_;
      auVar33._24_4_ = fVar222 * auVar90._24_4_;
      auVar33._28_4_ = auVar90._28_4_;
      auVar90 = vminps_avx512vl(auVar32,auVar104);
      auVar40 = ZEXT812(0);
      auVar100 = ZEXT1232(auVar40) << 0x20;
      auVar90 = vmaxps_avx(auVar90,ZEXT1232(auVar40) << 0x20);
      auVar101 = vminps_avx512vl(auVar33,auVar104);
      auVar34._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar34._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar34._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar34._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar34._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar34._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar34._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar34._28_4_ = auVar90._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar34,auVar148,auVar229);
      auVar90 = vmaxps_avx(auVar101,ZEXT1232(auVar40) << 0x20);
      auVar35._4_4_ = (auVar90._4_4_ + 1.0) * 0.125;
      auVar35._0_4_ = (auVar90._0_4_ + 0.0) * 0.125;
      auVar35._8_4_ = (auVar90._8_4_ + 2.0) * 0.125;
      auVar35._12_4_ = (auVar90._12_4_ + 3.0) * 0.125;
      auVar35._16_4_ = (auVar90._16_4_ + 4.0) * 0.125;
      auVar35._20_4_ = (auVar90._20_4_ + 5.0) * 0.125;
      auVar35._24_4_ = (auVar90._24_4_ + 6.0) * 0.125;
      auVar35._28_4_ = auVar90._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar35,auVar148,auVar229);
      auVar36._4_4_ = auVar83._4_4_ * auVar83._4_4_;
      auVar36._0_4_ = auVar83._0_4_ * auVar83._0_4_;
      auVar36._8_4_ = auVar83._8_4_ * auVar83._8_4_;
      auVar36._12_4_ = auVar83._12_4_ * auVar83._12_4_;
      auVar36._16_4_ = auVar83._16_4_ * auVar83._16_4_;
      auVar36._20_4_ = auVar83._20_4_ * auVar83._20_4_;
      auVar36._24_4_ = auVar83._24_4_ * auVar83._24_4_;
      auVar36._28_4_ = auVar83._28_4_;
      auVar90 = vsubps_avx(local_740,auVar36);
      auVar37._4_4_ = auVar90._4_4_ * (float)local_620._4_4_;
      auVar37._0_4_ = auVar90._0_4_ * (float)local_620._0_4_;
      auVar37._8_4_ = auVar90._8_4_ * fStack_618;
      auVar37._12_4_ = auVar90._12_4_ * fStack_614;
      auVar37._16_4_ = auVar90._16_4_ * fStack_610;
      auVar37._20_4_ = auVar90._20_4_ * fStack_60c;
      auVar37._24_4_ = auVar90._24_4_ * fStack_608;
      auVar37._28_4_ = auVar83._28_4_;
      auVar83 = vsubps_avx(auVar105,auVar37);
      uVar12 = vcmpps_avx512vl(auVar83,ZEXT1232(auVar40) << 0x20,5);
      bVar53 = (byte)uVar12;
      if (bVar53 == 0) {
        bVar53 = 0;
        auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar238 = ZEXT864(0) << 0x20;
        auVar83 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar264 = ZEXT864(0) << 0x20;
        auVar107._8_4_ = 0x7f800000;
        auVar107._0_8_ = 0x7f8000007f800000;
        auVar107._12_4_ = 0x7f800000;
        auVar107._16_4_ = 0x7f800000;
        auVar107._20_4_ = 0x7f800000;
        auVar107._24_4_ = 0x7f800000;
        auVar107._28_4_ = 0x7f800000;
        auVar120._8_4_ = 0xff800000;
        auVar120._0_8_ = 0xff800000ff800000;
        auVar120._12_4_ = 0xff800000;
        auVar120._16_4_ = 0xff800000;
        auVar120._20_4_ = 0xff800000;
        auVar120._24_4_ = 0xff800000;
        auVar120._28_4_ = 0xff800000;
      }
      else {
        auVar67 = vxorps_avx512vl(auVar139,auVar139);
        uVar58 = vcmpps_avx512vl(auVar83,auVar94,5);
        auVar83 = vsqrtps_avx(auVar83);
        auVar100 = vfnmadd213ps_avx512vl(local_640,local_660,auVar104);
        auVar60 = vfmadd132ps_fma(auVar100,local_660,local_660);
        auVar100 = vsubps_avx(local_680,auVar83);
        auVar38._4_4_ = auVar60._4_4_ * auVar100._4_4_;
        auVar38._0_4_ = auVar60._0_4_ * auVar100._0_4_;
        auVar38._8_4_ = auVar60._8_4_ * auVar100._8_4_;
        auVar38._12_4_ = auVar60._12_4_ * auVar100._12_4_;
        auVar38._16_4_ = auVar100._16_4_ * 0.0;
        auVar38._20_4_ = auVar100._20_4_ * 0.0;
        auVar38._24_4_ = auVar100._24_4_ * 0.0;
        auVar38._28_4_ = 0x3e000000;
        auVar83 = vsubps_avx512vl(auVar83,auVar107);
        auVar275._0_4_ = auVar60._0_4_ * auVar83._0_4_;
        auVar275._4_4_ = auVar60._4_4_ * auVar83._4_4_;
        auVar275._8_4_ = auVar60._8_4_ * auVar83._8_4_;
        auVar275._12_4_ = auVar60._12_4_ * auVar83._12_4_;
        auVar275._16_4_ = auVar83._16_4_ * 0.0;
        auVar275._20_4_ = auVar83._20_4_ * 0.0;
        auVar275._24_4_ = auVar83._24_4_ * 0.0;
        auVar275._28_4_ = 0;
        auVar83 = vfmadd213ps_avx512vl(auVar106,auVar38,auVar89);
        auVar263._0_4_ = fVar224 * auVar83._0_4_;
        auVar263._4_4_ = fVar197 * auVar83._4_4_;
        auVar263._8_4_ = fVar218 * auVar83._8_4_;
        auVar263._12_4_ = fVar219 * auVar83._12_4_;
        auVar263._16_4_ = fVar220 * auVar83._16_4_;
        auVar263._20_4_ = fVar221 * auVar83._20_4_;
        auVar263._24_4_ = fVar222 * auVar83._24_4_;
        auVar263._28_4_ = 0;
        auVar83 = vmulps_avx512vl(local_5c0,auVar38);
        auVar100 = vmulps_avx512vl(local_5e0,auVar38);
        auVar102 = vmulps_avx512vl(local_600,auVar38);
        auVar101 = vfmadd213ps_avx512vl(auVar85,auVar263,auVar91);
        auVar83 = vsubps_avx512vl(auVar83,auVar101);
        auVar101 = vfmadd213ps_avx512vl(auVar86,auVar263,auVar92);
        auVar101 = vsubps_avx512vl(auVar100,auVar101);
        auVar60 = vfmadd213ps_fma(auVar263,auVar88,auVar93);
        auVar100 = vsubps_avx(auVar102,ZEXT1632(auVar60));
        auVar264 = ZEXT3264(auVar100);
        auVar89 = vfmadd213ps_avx512vl(auVar106,auVar275,auVar89);
        auVar87 = vmulps_avx512vl(auVar87,auVar89);
        auVar89 = vmulps_avx512vl(local_5c0,auVar275);
        auVar102 = vmulps_avx512vl(local_5e0,auVar275);
        auVar94 = vmulps_avx512vl(local_600,auVar275);
        auVar60 = vfmadd213ps_fma(auVar85,auVar87,auVar91);
        auVar100 = vsubps_avx(auVar89,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar86,auVar87,auVar92);
        auVar85 = vsubps_avx512vl(auVar102,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar88,auVar87,auVar93);
        auVar86 = vsubps_avx512vl(auVar94,ZEXT1632(auVar60));
        auVar238 = ZEXT3264(auVar86);
        auVar149._8_4_ = 0x7f800000;
        auVar149._0_8_ = 0x7f8000007f800000;
        auVar149._12_4_ = 0x7f800000;
        auVar149._16_4_ = 0x7f800000;
        auVar149._20_4_ = 0x7f800000;
        auVar149._24_4_ = 0x7f800000;
        auVar149._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar149,auVar38);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar107._0_4_ = (uint)bVar57 * auVar86._0_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar57 * auVar86._4_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar57 * auVar86._8_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar57 * auVar86._12_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar107._16_4_ = (uint)bVar57 * auVar86._16_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar107._20_4_ = (uint)bVar57 * auVar86._20_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar107._24_4_ = (uint)bVar57 * auVar86._24_4_ | (uint)!bVar57 * 0x7f800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar107._28_4_ = (uint)bVar57 * auVar86._28_4_ | (uint)!bVar57 * 0x7f800000;
        auVar194._8_4_ = 0xff800000;
        auVar194._0_8_ = 0xff800000ff800000;
        auVar194._12_4_ = 0xff800000;
        auVar194._16_4_ = 0xff800000;
        auVar194._20_4_ = 0xff800000;
        auVar194._24_4_ = 0xff800000;
        auVar194._28_4_ = 0xff800000;
        auVar86 = vblendmps_avx512vl(auVar194,auVar275);
        bVar57 = (bool)((byte)uVar58 & 1);
        auVar120._0_4_ = (uint)bVar57 * auVar86._0_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar57 * auVar86._4_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar57 * auVar86._8_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar57 * auVar86._12_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar57 * auVar86._16_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar57 * auVar86._20_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar57 * auVar86._24_4_ | (uint)!bVar57 * -0x800000;
        bVar57 = SUB81(uVar58 >> 7,0);
        auVar120._28_4_ = (uint)bVar57 * auVar86._28_4_ | (uint)!bVar57 * -0x800000;
        auVar26._8_4_ = 0x36000000;
        auVar26._0_8_ = 0x3600000036000000;
        auVar26._12_4_ = 0x36000000;
        auVar26._16_4_ = 0x36000000;
        auVar26._20_4_ = 0x36000000;
        auVar26._24_4_ = 0x36000000;
        auVar26._28_4_ = 0x36000000;
        auVar86 = vmulps_avx512vl(local_820,auVar26);
        uVar54 = vcmpps_avx512vl(auVar86,local_6a0,0xe);
        uVar58 = uVar58 & uVar54;
        bVar52 = (byte)uVar58;
        if (bVar52 != 0) {
          uVar54 = vcmpps_avx512vl(auVar90,ZEXT1632(auVar67),2);
          auVar257._8_4_ = 0x7f800000;
          auVar257._0_8_ = 0x7f8000007f800000;
          auVar257._12_4_ = 0x7f800000;
          auVar257._16_4_ = 0x7f800000;
          auVar257._20_4_ = 0x7f800000;
          auVar257._24_4_ = 0x7f800000;
          auVar257._28_4_ = 0x7f800000;
          auVar270._8_4_ = 0xff800000;
          auVar270._0_8_ = 0xff800000ff800000;
          auVar270._12_4_ = 0xff800000;
          auVar270._16_4_ = 0xff800000;
          auVar270._20_4_ = 0xff800000;
          auVar270._24_4_ = 0xff800000;
          auVar270._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar257,auVar270);
          bVar47 = (byte)uVar54;
          uVar59 = (uint)(bVar47 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar86._0_4_;
          bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
          uVar130 = (uint)bVar57 * auVar88._4_4_ | (uint)!bVar57 * auVar86._4_4_;
          bVar57 = (bool)((byte)(uVar54 >> 2) & 1);
          uVar131 = (uint)bVar57 * auVar88._8_4_ | (uint)!bVar57 * auVar86._8_4_;
          bVar57 = (bool)((byte)(uVar54 >> 3) & 1);
          uVar132 = (uint)bVar57 * auVar88._12_4_ | (uint)!bVar57 * auVar86._12_4_;
          bVar57 = (bool)((byte)(uVar54 >> 4) & 1);
          uVar133 = (uint)bVar57 * auVar88._16_4_ | (uint)!bVar57 * auVar86._16_4_;
          bVar57 = (bool)((byte)(uVar54 >> 5) & 1);
          uVar134 = (uint)bVar57 * auVar88._20_4_ | (uint)!bVar57 * auVar86._20_4_;
          bVar57 = (bool)((byte)(uVar54 >> 6) & 1);
          uVar135 = (uint)bVar57 * auVar88._24_4_ | (uint)!bVar57 * auVar86._24_4_;
          bVar57 = SUB81(uVar54 >> 7,0);
          uVar136 = (uint)bVar57 * auVar88._28_4_ | (uint)!bVar57 * auVar86._28_4_;
          auVar107._0_4_ = (bVar52 & 1) * uVar59 | !(bool)(bVar52 & 1) * auVar107._0_4_;
          bVar57 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar107._4_4_ = bVar57 * uVar130 | !bVar57 * auVar107._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar107._8_4_ = bVar57 * uVar131 | !bVar57 * auVar107._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar107._12_4_ = bVar57 * uVar132 | !bVar57 * auVar107._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar107._16_4_ = bVar57 * uVar133 | !bVar57 * auVar107._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar107._20_4_ = bVar57 * uVar134 | !bVar57 * auVar107._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar107._24_4_ = bVar57 * uVar135 | !bVar57 * auVar107._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar107._28_4_ = bVar57 * uVar136 | !bVar57 * auVar107._28_4_;
          auVar86 = vblendmps_avx512vl(auVar270,auVar257);
          bVar57 = (bool)((byte)(uVar54 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar54 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar54 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar54 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar54 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar54 >> 6) & 1);
          bVar10 = SUB81(uVar54 >> 7,0);
          auVar120._0_4_ =
               (uint)(bVar52 & 1) *
               ((uint)(bVar47 & 1) * auVar86._0_4_ | !(bool)(bVar47 & 1) * uVar59) |
               !(bool)(bVar52 & 1) * auVar120._0_4_;
          bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar120._4_4_ =
               (uint)bVar4 * ((uint)bVar57 * auVar86._4_4_ | !bVar57 * uVar130) |
               !bVar4 * auVar120._4_4_;
          bVar57 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar120._8_4_ =
               (uint)bVar57 * ((uint)bVar5 * auVar86._8_4_ | !bVar5 * uVar131) |
               !bVar57 * auVar120._8_4_;
          bVar57 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar120._12_4_ =
               (uint)bVar57 * ((uint)bVar6 * auVar86._12_4_ | !bVar6 * uVar132) |
               !bVar57 * auVar120._12_4_;
          bVar57 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar120._16_4_ =
               (uint)bVar57 * ((uint)bVar7 * auVar86._16_4_ | !bVar7 * uVar133) |
               !bVar57 * auVar120._16_4_;
          bVar57 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar120._20_4_ =
               (uint)bVar57 * ((uint)bVar8 * auVar86._20_4_ | !bVar8 * uVar134) |
               !bVar57 * auVar120._20_4_;
          bVar57 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar120._24_4_ =
               (uint)bVar57 * ((uint)bVar9 * auVar86._24_4_ | !bVar9 * uVar135) |
               !bVar57 * auVar120._24_4_;
          bVar57 = SUB81(uVar58 >> 7,0);
          auVar120._28_4_ =
               (uint)bVar57 * ((uint)bVar10 * auVar86._28_4_ | !bVar10 * uVar136) |
               !bVar57 * auVar120._28_4_;
          bVar53 = (~bVar52 | bVar47) & bVar53;
        }
      }
      auVar258._0_4_ = local_600._0_4_ * auVar238._0_4_;
      auVar258._4_4_ = local_600._4_4_ * auVar238._4_4_;
      auVar258._8_4_ = local_600._8_4_ * auVar238._8_4_;
      auVar258._12_4_ = local_600._12_4_ * auVar238._12_4_;
      auVar258._16_4_ = local_600._16_4_ * auVar238._16_4_;
      auVar258._20_4_ = local_600._20_4_ * auVar238._20_4_;
      auVar258._28_36_ = auVar238._28_36_;
      auVar258._24_4_ = local_600._24_4_ * auVar238._24_4_;
      auVar60 = vfmadd231ps_fma(auVar258._0_32_,local_5e0,auVar85);
      auVar258 = ZEXT3264(local_5c0);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),local_5c0,auVar100);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar252._16_4_ = 0x7fffffff;
      auVar252._20_4_ = 0x7fffffff;
      auVar252._24_4_ = 0x7fffffff;
      auVar252._28_4_ = 0x7fffffff;
      auVar253 = ZEXT3264(auVar252);
      auVar85 = vandps_avx(ZEXT1632(auVar60),auVar252);
      auVar266 = ZEXT3264(auVar84);
      _local_1c0 = auVar84;
      auVar244._8_4_ = 0x3e99999a;
      auVar244._0_8_ = 0x3e99999a3e99999a;
      auVar244._12_4_ = 0x3e99999a;
      auVar244._16_4_ = 0x3e99999a;
      auVar244._20_4_ = 0x3e99999a;
      auVar244._24_4_ = 0x3e99999a;
      auVar244._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar85,auVar244,1);
      _local_580 = vmaxps_avx(auVar84,auVar120);
      _local_380 = _local_580;
      auVar85 = vminps_avx(local_360,auVar107);
      uVar14 = vcmpps_avx512vl(auVar84,auVar85,2);
      bVar52 = (byte)uVar14 & bVar46;
      uVar13 = vcmpps_avx512vl(_local_580,local_360,2);
      if ((bVar46 & ((byte)uVar13 | (byte)uVar14)) != 0) {
        bVar47 = (byte)uVar12 | ~bVar53;
        auVar39._4_4_ = local_600._4_4_ * auVar264._4_4_;
        auVar39._0_4_ = local_600._0_4_ * auVar264._0_4_;
        auVar39._8_4_ = local_600._8_4_ * auVar264._8_4_;
        auVar39._12_4_ = local_600._12_4_ * auVar264._12_4_;
        auVar39._16_4_ = local_600._16_4_ * auVar264._16_4_;
        auVar39._20_4_ = local_600._20_4_ * auVar264._20_4_;
        auVar39._24_4_ = local_600._24_4_ * auVar264._24_4_;
        auVar39._28_4_ = auVar85._28_4_;
        auVar60 = vfmadd213ps_fma(auVar101,local_5e0,auVar39);
        auVar60 = vfmadd213ps_fma(auVar83,local_5c0,ZEXT1632(auVar60));
        auVar83 = vandps_avx(ZEXT1632(auVar60),auVar252);
        uVar12 = vcmpps_avx512vl(auVar83,auVar244,1);
        bVar53 = (byte)uVar12 | ~bVar53;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar27._8_4_ = 3;
        auVar27._0_8_ = 0x300000003;
        auVar27._12_4_ = 3;
        auVar27._16_4_ = 3;
        auVar27._20_4_ = 3;
        auVar27._24_4_ = 3;
        auVar27._28_4_ = 3;
        auVar83 = vpblendmd_avx512vl(auVar150,auVar27);
        local_340._0_4_ = (uint)(bVar53 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar57 = (bool)(bVar53 >> 1 & 1);
        local_340._4_4_ = (uint)bVar57 * auVar83._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 2 & 1);
        local_340._8_4_ = (uint)bVar57 * auVar83._8_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 3 & 1);
        local_340._12_4_ = (uint)bVar57 * auVar83._12_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 4 & 1);
        local_340._16_4_ = (uint)bVar57 * auVar83._16_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 5 & 1);
        local_340._20_4_ = (uint)bVar57 * auVar83._20_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar53 >> 6 & 1);
        local_340._24_4_ = (uint)bVar57 * auVar83._24_4_ | (uint)!bVar57 * 2;
        local_340._28_4_ = (uint)(bVar53 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        local_500 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_500,local_340,5);
        local_560 = auVar84._0_4_ + (float)local_5a0._0_4_;
        fStack_55c = auVar84._4_4_ + (float)local_5a0._4_4_;
        fStack_558 = auVar84._8_4_ + fStack_598;
        fStack_554 = auVar84._12_4_ + fStack_594;
        fStack_550 = auVar84._16_4_ + fStack_590;
        fStack_54c = auVar84._20_4_ + fStack_58c;
        fStack_548 = auVar84._24_4_ + fStack_588;
        fStack_544 = auVar84._28_4_ + fStack_584;
        for (bVar53 = (byte)uVar12 & bVar52; auVar83 = _local_380,
            auVar123._16_16_ = auVar82._16_16_, bVar53 != 0;
            bVar53 = ~bVar55 & bVar53 & (byte)uVar12) {
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar83 = vblendmps_avx512vl(auVar151,auVar84);
          auVar121._0_4_ =
               (uint)(bVar53 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar121._4_4_ = (uint)bVar57 * auVar83._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar121._8_4_ = (uint)bVar57 * auVar83._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar121._12_4_ = (uint)bVar57 * auVar83._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar121._16_4_ = (uint)bVar57 * auVar83._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar121._20_4_ = (uint)bVar57 * auVar83._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar121._24_4_ =
               (uint)(bVar53 >> 6) * auVar83._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar121._28_4_ = 0x7f800000;
          auVar83 = vshufps_avx(auVar121,auVar121,0xb1);
          auVar83 = vminps_avx(auVar121,auVar83);
          auVar85 = vshufpd_avx(auVar83,auVar83,5);
          auVar83 = vminps_avx(auVar83,auVar85);
          auVar85 = vpermpd_avx2(auVar83,0x4e);
          auVar83 = vminps_avx(auVar83,auVar85);
          uVar12 = vcmpps_avx512vl(auVar121,auVar83,0);
          bVar48 = (byte)uVar12 & bVar53;
          bVar55 = bVar53;
          if (bVar48 != 0) {
            bVar55 = bVar48;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar55; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar55 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_1e0 + (uint)(iVar15 << 2));
          uVar130 = *(uint *)(local_1c0 + (uint)(iVar15 << 2));
          fVar224 = auVar65._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar264 = ZEXT1664(auVar264._0_16_);
            auVar266 = ZEXT1664(auVar266._0_16_);
            fVar224 = sqrtf((float)local_7e0._0_4_);
          }
          auVar253 = ZEXT464(uVar130);
          uVar58 = (ulong)bVar55;
          auVar67 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar60 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar72 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar61 = vminps_avx(auVar67,auVar72);
          auVar67 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar72 = vmaxps_avx(auVar60,auVar67);
          auVar201._8_4_ = 0x7fffffff;
          auVar201._0_8_ = 0x7fffffff7fffffff;
          auVar201._12_4_ = 0x7fffffff;
          auVar60 = vandps_avx(auVar61,auVar201);
          auVar67 = vandps_avx(auVar72,auVar201);
          auVar60 = vmaxps_avx(auVar60,auVar67);
          auVar67 = vmovshdup_avx(auVar60);
          auVar67 = vmaxss_avx(auVar67,auVar60);
          auVar60 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vmaxss_avx(auVar60,auVar67);
          fVar197 = auVar60._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar72,auVar72,0xff);
          auVar60 = vinsertps_avx(ZEXT416(uVar130),ZEXT416(uVar59),0x10);
          uVar54 = 0;
          while( true ) {
            bVar48 = (byte)uVar58;
            if (uVar54 == 5) break;
            uVar157 = auVar60._0_4_;
            auVar140._4_4_ = uVar157;
            auVar140._0_4_ = uVar157;
            auVar140._8_4_ = uVar157;
            auVar140._12_4_ = uVar157;
            auVar67 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_7d0);
            auVar72 = vmovshdup_avx(auVar60);
            fVar245 = auVar72._0_4_;
            fVar223 = 1.0 - fVar245;
            fVar218 = fVar245 * fVar245;
            auVar69 = SUB6416(ZEXT464(0x40400000),0);
            auVar62 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar265 = vfmadd213ss_fma(auVar69,auVar72,auVar62);
            auVar61 = vfmadd213ss_fma(auVar265,ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x40000000),0)
                                     );
            auVar68 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar223),auVar62);
            auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar223 * fVar223)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar219 = fVar223 * fVar223 * -fVar245 * 0.5;
            fVar220 = auVar61._0_4_ * 0.5;
            fVar221 = auVar68._0_4_ * 0.5;
            fVar222 = fVar245 * fVar245 * -fVar223 * 0.5;
            auVar202._0_4_ = fVar222 * (float)local_7c0._0_4_;
            auVar202._4_4_ = fVar222 * (float)local_7c0._4_4_;
            auVar202._8_4_ = fVar222 * fStack_7b8;
            auVar202._12_4_ = fVar222 * fStack_7b4;
            auVar227._4_4_ = fVar221;
            auVar227._0_4_ = fVar221;
            auVar227._8_4_ = fVar221;
            auVar227._12_4_ = fVar221;
            auVar61 = vfmadd132ps_fma(auVar227,auVar202,local_780._0_16_);
            auVar178._4_4_ = fVar220;
            auVar178._0_4_ = fVar220;
            auVar178._8_4_ = fVar220;
            auVar178._12_4_ = fVar220;
            auVar61 = vfmadd132ps_fma(auVar178,auVar61,local_7a0._0_16_);
            auVar203._4_4_ = fVar219;
            auVar203._0_4_ = fVar219;
            auVar203._8_4_ = fVar219;
            auVar203._12_4_ = fVar219;
            auVar61 = vfmadd132ps_fma(auVar203,auVar61,local_760._0_16_);
            auVar68 = vfmadd231ss_fma(auVar62,auVar72,ZEXT416(0x41100000));
            local_640._0_16_ = auVar68;
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar72,ZEXT416(0x40800000));
            local_660._0_16_ = auVar68;
            auVar68 = vfmadd213ss_fma(auVar69,auVar72,ZEXT416(0xbf800000));
            local_680._0_16_ = auVar68;
            _local_620 = auVar61;
            auVar61 = vsubps_avx(auVar67,auVar61);
            auVar67 = vdpps_avx(auVar61,auVar61,0x7f);
            fVar219 = auVar67._0_4_;
            local_740 = ZEXT1632(auVar60);
            if (fVar219 < 0.0) {
              local_800._0_4_ = fVar218;
              local_820._0_4_ = fVar223 * -2.0;
              auVar264._0_4_ = sqrtf(fVar219);
              auVar264._4_60_ = extraout_var;
              auVar265 = ZEXT416(auVar265._0_4_);
              auVar60 = auVar264._0_16_;
              uVar58 = extraout_RAX;
            }
            else {
              auVar60 = vsqrtss_avx(auVar67,auVar67);
              local_820._0_4_ = fVar223 * -2.0;
              local_800._0_4_ = fVar218;
            }
            auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar245 * (fVar223 + fVar223))),
                                       ZEXT416((uint)fVar223),ZEXT416((uint)fVar223));
            auVar265 = vfmadd213ss_fma(auVar265,ZEXT416((uint)(fVar245 + fVar245)),
                                       ZEXT416((uint)(fVar245 * fVar245 * 3.0)));
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar72,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                      ZEXT416((uint)(fVar223 + fVar223)),auVar68);
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar72,
                                      ZEXT416((uint)local_800._0_4_));
            fVar218 = auVar69._0_4_ * 0.5;
            fVar220 = auVar265._0_4_ * 0.5;
            fVar221 = auVar62._0_4_ * 0.5;
            fVar222 = auVar68._0_4_ * 0.5;
            auVar204._0_4_ = fVar222 * (float)local_7c0._0_4_;
            auVar204._4_4_ = fVar222 * (float)local_7c0._4_4_;
            auVar204._8_4_ = fVar222 * fStack_7b8;
            auVar204._12_4_ = fVar222 * fStack_7b4;
            auVar179._4_4_ = fVar221;
            auVar179._0_4_ = fVar221;
            auVar179._8_4_ = fVar221;
            auVar179._12_4_ = fVar221;
            auVar265 = vfmadd132ps_fma(auVar179,auVar204,local_780._0_16_);
            auVar160._4_4_ = fVar220;
            auVar160._0_4_ = fVar220;
            auVar160._8_4_ = fVar220;
            auVar160._12_4_ = fVar220;
            auVar265 = vfmadd132ps_fma(auVar160,auVar265,local_7a0._0_16_);
            auVar268._4_4_ = fVar218;
            auVar268._0_4_ = fVar218;
            auVar268._8_4_ = fVar218;
            auVar268._12_4_ = fVar218;
            auVar265 = vfmadd132ps_fma(auVar268,auVar265,local_760._0_16_);
            local_800._0_16_ = vdpps_avx(auVar265,auVar265,0x7f);
            auVar41._12_4_ = 0;
            auVar41._0_12_ = ZEXT812(0);
            fVar218 = local_800._0_4_;
            auVar68 = vrsqrt14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar218));
            fVar220 = auVar68._0_4_;
            local_820._0_16_ = vrcp14ss_avx512f(auVar41 << 0x20,ZEXT416((uint)fVar218));
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(local_800._0_16_,auVar17);
            auVar68 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_6a0._0_4_ = auVar68._0_4_;
            uVar59 = auVar60._0_4_;
            if (fVar218 < auVar62._0_4_) {
              fVar221 = sqrtf(fVar218);
              auVar60 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_00;
            }
            else {
              auVar68 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
              fVar221 = auVar68._0_4_;
            }
            fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
            auVar141._0_4_ = auVar265._0_4_ * fVar218;
            auVar141._4_4_ = auVar265._4_4_ * fVar218;
            auVar141._8_4_ = auVar265._8_4_ * fVar218;
            auVar141._12_4_ = auVar265._12_4_ * fVar218;
            auVar68 = vdpps_avx(auVar61,auVar141,0x7f);
            fVar223 = auVar60._0_4_;
            fVar220 = auVar68._0_4_;
            auVar142._0_4_ = fVar220 * fVar220;
            auVar142._4_4_ = auVar68._4_4_ * auVar68._4_4_;
            auVar142._8_4_ = auVar68._8_4_ * auVar68._8_4_;
            auVar142._12_4_ = auVar68._12_4_ * auVar68._12_4_;
            auVar62 = vsubps_avx512vl(auVar67,auVar142);
            fVar222 = auVar62._0_4_;
            auVar161._4_12_ = ZEXT812(0) << 0x20;
            auVar161._0_4_ = fVar222;
            auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
            auVar70 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
            if (fVar222 < 0.0) {
              local_6d0 = fVar218;
              fStack_6cc = fVar218;
              fStack_6c8 = fVar218;
              fStack_6c4 = fVar218;
              local_6c0 = auVar69;
              fVar222 = sqrtf(fVar222);
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar60 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_01;
              auVar62 = local_6c0;
              fVar218 = local_6d0;
              fVar245 = fStack_6cc;
              fVar246 = fStack_6c8;
              fVar247 = fStack_6c4;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
              fVar222 = auVar62._0_4_;
              auVar62 = auVar69;
              fVar245 = fVar218;
              fVar246 = fVar218;
              fVar247 = fVar218;
            }
            auVar264 = ZEXT1664(auVar61);
            auVar162._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
            auVar162._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
            auVar162._8_4_ = (float)local_680._0_4_ * fStack_7b8;
            auVar162._12_4_ = (float)local_680._0_4_ * fStack_7b4;
            auVar180._4_4_ = local_660._0_4_;
            auVar180._0_4_ = local_660._0_4_;
            auVar180._8_4_ = local_660._0_4_;
            auVar180._12_4_ = local_660._0_4_;
            auVar64 = vfmadd132ps_fma(auVar180,auVar162,local_780._0_16_);
            auVar163._4_4_ = local_640._0_4_;
            auVar163._0_4_ = local_640._0_4_;
            auVar163._8_4_ = local_640._0_4_;
            auVar163._12_4_ = local_640._0_4_;
            auVar64 = vfmadd132ps_fma(auVar163,auVar64,local_7a0._0_16_);
            auVar72 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar157 = auVar72._0_4_;
            auVar181._4_4_ = uVar157;
            auVar181._0_4_ = uVar157;
            auVar181._8_4_ = uVar157;
            auVar181._12_4_ = uVar157;
            auVar72 = vfmadd132ps_fma(auVar181,auVar64,local_760._0_16_);
            auVar164._0_4_ = auVar72._0_4_ * (float)local_800._0_4_;
            auVar164._4_4_ = auVar72._4_4_ * (float)local_800._0_4_;
            auVar164._8_4_ = auVar72._8_4_ * (float)local_800._0_4_;
            auVar164._12_4_ = auVar72._12_4_ * (float)local_800._0_4_;
            auVar72 = vdpps_avx(auVar265,auVar72,0x7f);
            fVar176 = auVar72._0_4_;
            auVar182._0_4_ = auVar265._0_4_ * fVar176;
            auVar182._4_4_ = auVar265._4_4_ * fVar176;
            auVar182._8_4_ = auVar265._8_4_ * fVar176;
            auVar182._12_4_ = auVar265._12_4_ * fVar176;
            auVar72 = vsubps_avx(auVar164,auVar182);
            fVar176 = (float)local_6a0._0_4_ * (float)local_820._0_4_;
            auVar64 = vmaxss_avx(ZEXT416((uint)fVar197),
                                 ZEXT416((uint)(local_740._0_4_ * fVar224 * 1.9073486e-06)));
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar265,auVar18);
            auVar183._0_4_ = fVar218 * auVar72._0_4_ * fVar176;
            auVar183._4_4_ = fVar245 * auVar72._4_4_ * fVar176;
            auVar183._8_4_ = fVar246 * auVar72._8_4_ * fVar176;
            auVar183._12_4_ = fVar247 * auVar72._12_4_ * fVar176;
            auVar266 = ZEXT1664(auVar141);
            auVar72 = vdpps_avx(auVar71,auVar141,0x7f);
            auVar63 = vfmadd213ss_fma(auVar60,ZEXT416((uint)fVar197),auVar64);
            auVar60 = vdpps_avx(auVar61,auVar183,0x7f);
            auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar223 + 1.0)),
                                      ZEXT416((uint)(fVar197 / fVar221)),auVar63);
            fVar218 = auVar72._0_4_ + auVar60._0_4_;
            auVar60 = vdpps_avx(local_7d0,auVar141,0x7f);
            auVar72 = vdpps_avx(auVar61,auVar71,0x7f);
            auVar70 = vmulss_avx512f(auVar70,auVar62);
            fVar221 = auVar69._0_4_ * 1.5 + auVar70._0_4_ * auVar62._0_4_ * auVar62._0_4_;
            auVar62 = vdpps_avx(auVar61,local_7d0,0x7f);
            auVar70 = vfnmadd231ss_fma(auVar72,auVar68,ZEXT416((uint)fVar218));
            auVar62 = vfnmadd231ss_fma(auVar62,auVar68,auVar60);
            auVar72 = vpermilps_avx(_local_620,0xff);
            fVar222 = fVar222 - auVar72._0_4_;
            auVar69 = vshufps_avx(auVar265,auVar265,0xff);
            auVar72 = vfmsub213ss_fma(auVar70,ZEXT416((uint)fVar221),auVar69);
            auVar255._8_4_ = 0x80000000;
            auVar255._0_8_ = 0x8000000080000000;
            auVar255._12_4_ = 0x80000000;
            auVar258 = ZEXT1664(auVar255);
            auVar250._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar250._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar250._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar253 = ZEXT1664(auVar250);
            auVar62 = ZEXT416((uint)(auVar62._0_4_ * fVar221));
            auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar72._0_4_)),
                                      ZEXT416((uint)fVar218),auVar62);
            auVar72 = vinsertps_avx(auVar250,auVar62,0x1c);
            auVar234._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar234._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar234._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar62 = vinsertps_avx(ZEXT416((uint)fVar218),auVar234,0x10);
            auVar205._0_4_ = auVar70._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar60 = vdivps_avx(auVar72,auVar205);
            auVar72 = vdivps_avx(auVar62,auVar205);
            auVar206._0_4_ = fVar220 * auVar60._0_4_ + fVar222 * auVar72._0_4_;
            auVar206._4_4_ = fVar220 * auVar60._4_4_ + fVar222 * auVar72._4_4_;
            auVar206._8_4_ = fVar220 * auVar60._8_4_ + fVar222 * auVar72._8_4_;
            auVar206._12_4_ = fVar220 * auVar60._12_4_ + fVar222 * auVar72._12_4_;
            auVar60 = vsubps_avx(local_740._0_16_,auVar206);
            auVar19._8_4_ = 0x7fffffff;
            auVar19._0_8_ = 0x7fffffff7fffffff;
            auVar19._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx512vl(auVar68,auVar19);
            if (auVar72._0_4_ < auVar63._0_4_) {
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar20);
              if (auVar68._0_4_ < auVar72._0_4_) {
                bVar57 = uVar54 < 5;
                fVar224 = auVar60._0_4_ + (float)local_6f0._0_4_;
                if ((fVar156 <= fVar224) &&
                   (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar224 <= fVar197)) {
                  auVar72 = vmovshdup_avx(auVar60);
                  bVar48 = 0;
                  if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_017f6c13;
                  auVar207._0_12_ = ZEXT812(0);
                  auVar207._12_4_ = 0;
                  auVar123._0_16_ = auVar207;
                  auVar122._4_28_ = auVar123._4_28_;
                  auVar122._0_4_ = fVar219;
                  auVar72 = vrsqrt14ss_avx512f(auVar207,auVar122._0_16_);
                  fVar218 = auVar72._0_4_;
                  auVar67 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar48 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017f6c13;
                    fVar218 = fVar218 * 1.5 + auVar67._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar184._0_4_ = auVar61._0_4_ * fVar218;
                    auVar184._4_4_ = auVar61._4_4_ * fVar218;
                    auVar184._8_4_ = auVar61._8_4_ * fVar218;
                    auVar184._12_4_ = auVar61._12_4_ * fVar218;
                    auVar68 = vfmadd213ps_fma(auVar69,auVar184,auVar265);
                    auVar67 = vshufps_avx(auVar184,auVar184,0xc9);
                    auVar72 = vshufps_avx(auVar265,auVar265,0xc9);
                    auVar185._0_4_ = auVar184._0_4_ * auVar72._0_4_;
                    auVar185._4_4_ = auVar184._4_4_ * auVar72._4_4_;
                    auVar185._8_4_ = auVar184._8_4_ * auVar72._8_4_;
                    auVar185._12_4_ = auVar184._12_4_ * auVar72._12_4_;
                    auVar265 = vfmsub231ps_fma(auVar185,auVar265,auVar67);
                    auVar67 = vshufps_avx(auVar265,auVar265,0xc9);
                    auVar72 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar265 = vshufps_avx(auVar265,auVar265,0xd2);
                    auVar143._0_4_ = auVar68._0_4_ * auVar265._0_4_;
                    auVar143._4_4_ = auVar68._4_4_ * auVar265._4_4_;
                    auVar143._8_4_ = auVar68._8_4_ * auVar265._8_4_;
                    auVar143._12_4_ = auVar68._12_4_ * auVar265._12_4_;
                    auVar67 = vfmsub231ps_fma(auVar143,auVar67,auVar72);
                    auVar215._8_4_ = 1;
                    auVar215._0_8_ = 0x100000001;
                    auVar215._12_4_ = 1;
                    auVar215._16_4_ = 1;
                    auVar215._20_4_ = 1;
                    auVar215._24_4_ = 1;
                    auVar215._28_4_ = 1;
                    local_440 = vpermps_avx2(auVar215,ZEXT1632(auVar60));
                    auVar83 = vpermps_avx2(auVar215,ZEXT1632(auVar67));
                    auVar230._8_4_ = 2;
                    auVar230._0_8_ = 0x200000002;
                    auVar230._12_4_ = 2;
                    auVar230._16_4_ = 2;
                    auVar230._20_4_ = 2;
                    auVar230._24_4_ = 2;
                    auVar230._28_4_ = 2;
                    local_480 = vpermps_avx2(auVar230,ZEXT1632(auVar67));
                    local_460 = auVar67._0_4_;
                    local_4a0[0] = (RTCHitN)auVar83[0];
                    local_4a0[1] = (RTCHitN)auVar83[1];
                    local_4a0[2] = (RTCHitN)auVar83[2];
                    local_4a0[3] = (RTCHitN)auVar83[3];
                    local_4a0[4] = (RTCHitN)auVar83[4];
                    local_4a0[5] = (RTCHitN)auVar83[5];
                    local_4a0[6] = (RTCHitN)auVar83[6];
                    local_4a0[7] = (RTCHitN)auVar83[7];
                    local_4a0[8] = (RTCHitN)auVar83[8];
                    local_4a0[9] = (RTCHitN)auVar83[9];
                    local_4a0[10] = (RTCHitN)auVar83[10];
                    local_4a0[0xb] = (RTCHitN)auVar83[0xb];
                    local_4a0[0xc] = (RTCHitN)auVar83[0xc];
                    local_4a0[0xd] = (RTCHitN)auVar83[0xd];
                    local_4a0[0xe] = (RTCHitN)auVar83[0xe];
                    local_4a0[0xf] = (RTCHitN)auVar83[0xf];
                    local_4a0[0x10] = (RTCHitN)auVar83[0x10];
                    local_4a0[0x11] = (RTCHitN)auVar83[0x11];
                    local_4a0[0x12] = (RTCHitN)auVar83[0x12];
                    local_4a0[0x13] = (RTCHitN)auVar83[0x13];
                    local_4a0[0x14] = (RTCHitN)auVar83[0x14];
                    local_4a0[0x15] = (RTCHitN)auVar83[0x15];
                    local_4a0[0x16] = (RTCHitN)auVar83[0x16];
                    local_4a0[0x17] = (RTCHitN)auVar83[0x17];
                    local_4a0[0x18] = (RTCHitN)auVar83[0x18];
                    local_4a0[0x19] = (RTCHitN)auVar83[0x19];
                    local_4a0[0x1a] = (RTCHitN)auVar83[0x1a];
                    local_4a0[0x1b] = (RTCHitN)auVar83[0x1b];
                    local_4a0[0x1c] = (RTCHitN)auVar83[0x1c];
                    local_4a0[0x1d] = (RTCHitN)auVar83[0x1d];
                    local_4a0[0x1e] = (RTCHitN)auVar83[0x1e];
                    local_4a0[0x1f] = (RTCHitN)auVar83[0x1f];
                    uStack_45c = local_460;
                    uStack_458 = local_460;
                    uStack_454 = local_460;
                    uStack_450 = local_460;
                    uStack_44c = local_460;
                    uStack_448 = local_460;
                    uStack_444 = local_460;
                    local_420 = ZEXT432(0) << 0x20;
                    local_400 = local_4c0._0_8_;
                    uStack_3f8 = local_4c0._8_8_;
                    uStack_3f0 = local_4c0._16_8_;
                    uStack_3e8 = local_4c0._24_8_;
                    local_3e0 = local_4e0;
                    vpcmpeqd_avx2(local_4e0,local_4e0);
                    local_3c0 = context->user->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = context->user->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar224;
                    local_720 = local_520;
                    local_850.valid = (int *)local_720;
                    local_850.geometryUserPtr = pGVar2->userPtr;
                    local_850.context = context->user;
                    local_850.hit = local_4a0;
                    local_850.N = 8;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar250);
                      auVar258 = ZEXT1664(auVar255);
                      auVar264 = ZEXT1664(auVar61);
                      auVar266 = ZEXT1664(auVar141);
                      (*pGVar2->occlusionFilterN)(&local_850);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        (*p_Var3)(&local_850);
                      }
                      uVar58 = vptestmd_avx512vl(local_720,local_720);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar58 & 1);
                      bVar5 = (bool)((byte)(uVar58 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar58 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar58 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar58 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar58 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar58 >> 6) & 1);
                      bVar11 = SUB81(uVar58 >> 7,0);
                      *(uint *)(local_850.ray + 0x100) =
                           (uint)bVar4 * auVar83._0_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x100);
                      *(uint *)(local_850.ray + 0x104) =
                           (uint)bVar5 * auVar83._4_4_ |
                           (uint)!bVar5 * *(int *)(local_850.ray + 0x104);
                      *(uint *)(local_850.ray + 0x108) =
                           (uint)bVar6 * auVar83._8_4_ |
                           (uint)!bVar6 * *(int *)(local_850.ray + 0x108);
                      *(uint *)(local_850.ray + 0x10c) =
                           (uint)bVar7 * auVar83._12_4_ |
                           (uint)!bVar7 * *(int *)(local_850.ray + 0x10c);
                      *(uint *)(local_850.ray + 0x110) =
                           (uint)bVar8 * auVar83._16_4_ |
                           (uint)!bVar8 * *(int *)(local_850.ray + 0x110);
                      *(uint *)(local_850.ray + 0x114) =
                           (uint)bVar9 * auVar83._20_4_ |
                           (uint)!bVar9 * *(int *)(local_850.ray + 0x114);
                      *(uint *)(local_850.ray + 0x118) =
                           (uint)bVar10 * auVar83._24_4_ |
                           (uint)!bVar10 * *(int *)(local_850.ray + 0x118);
                      *(uint *)(local_850.ray + 0x11c) =
                           (uint)bVar11 * auVar83._28_4_ |
                           (uint)!bVar11 * *(int *)(local_850.ray + 0x11c);
                      bVar48 = 1;
                      if (local_720 != (undefined1  [32])0x0) goto LAB_017f6c13;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                    bVar48 = 0;
                    goto LAB_017f6c13;
                  }
                }
                bVar48 = 0;
                goto LAB_017f6c13;
              }
            }
            uVar54 = uVar54 + 1;
          }
          bVar57 = false;
LAB_017f6c13:
          bVar49 = bVar49 | bVar57 & bVar48;
          uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar236._4_4_ = uVar157;
          auVar236._0_4_ = uVar157;
          auVar236._8_4_ = uVar157;
          auVar236._12_4_ = uVar157;
          auVar236._16_4_ = uVar157;
          auVar236._20_4_ = uVar157;
          auVar236._24_4_ = uVar157;
          auVar236._28_4_ = uVar157;
          auVar175 = ZEXT3264(auVar236);
          auVar43._4_4_ = fStack_55c;
          auVar43._0_4_ = local_560;
          auVar43._8_4_ = fStack_558;
          auVar43._12_4_ = fStack_554;
          auVar43._16_4_ = fStack_550;
          auVar43._20_4_ = fStack_54c;
          auVar43._24_4_ = fStack_548;
          auVar43._28_4_ = fStack_544;
          uVar12 = vcmpps_avx512vl(auVar236,auVar43,0xd);
        }
        auVar152._0_4_ = (float)local_5a0._0_4_ + (float)local_580._0_4_;
        auVar152._4_4_ = (float)local_5a0._4_4_ + (float)local_580._4_4_;
        auVar152._8_4_ = fStack_598 + fStack_578;
        auVar152._12_4_ = fStack_594 + fStack_574;
        auVar152._16_4_ = fStack_590 + fStack_570;
        auVar152._20_4_ = fStack_58c + fStack_56c;
        auVar152._24_4_ = fStack_588 + fStack_568;
        auVar152._28_4_ = fStack_584 + fStack_564;
        uVar157 = auVar175._0_4_;
        auVar171._4_4_ = uVar157;
        auVar171._0_4_ = uVar157;
        auVar171._8_4_ = uVar157;
        auVar171._12_4_ = uVar157;
        auVar171._16_4_ = uVar157;
        auVar171._20_4_ = uVar157;
        auVar171._24_4_ = uVar157;
        auVar171._28_4_ = uVar157;
        uVar12 = vcmpps_avx512vl(auVar152,auVar171,2);
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar153,auVar28);
        local_580._0_4_ = (uint)(bVar47 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar47 & 1) * 2;
        bVar57 = (bool)(bVar47 >> 1 & 1);
        local_580._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * 2;
        bVar57 = (bool)(bVar47 >> 2 & 1);
        fStack_578 = (float)((uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 3 & 1);
        fStack_574 = (float)((uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 4 & 1);
        fStack_570 = (float)((uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 5 & 1);
        fStack_56c = (float)((uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * 2);
        bVar57 = (bool)(bVar47 >> 6 & 1);
        fStack_568 = (float)((uint)bVar57 * auVar84._24_4_ | (uint)!bVar57 * 2);
        fStack_564 = (float)((uint)(bVar47 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar47 >> 7) * 2);
        bVar46 = (byte)uVar13 & bVar46 & (byte)uVar12;
        uVar12 = vpcmpd_avx512vl(_local_580,local_500,2);
        local_560 = (float)local_5a0._0_4_ + (float)local_380._0_4_;
        fStack_55c = (float)local_5a0._4_4_ + (float)local_380._4_4_;
        fStack_558 = fStack_598 + fStack_378;
        fStack_554 = fStack_594 + fStack_374;
        fStack_550 = fStack_590 + fStack_370;
        fStack_54c = fStack_58c + fStack_36c;
        fStack_548 = fStack_588 + fStack_368;
        fStack_544 = fStack_584 + fStack_364;
        for (bVar53 = (byte)uVar12 & bVar46; bVar53 != 0; bVar53 = ~bVar47 & bVar53 & (byte)uVar12)
        {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar84 = vblendmps_avx512vl(auVar154,auVar83);
          auVar124._0_4_ =
               (uint)(bVar53 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 1 & 1);
          auVar124._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 2 & 1);
          auVar124._8_4_ = (uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 3 & 1);
          auVar124._12_4_ = (uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 4 & 1);
          auVar124._16_4_ = (uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * 0x7f800000;
          bVar57 = (bool)(bVar53 >> 5 & 1);
          auVar124._20_4_ = (uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * 0x7f800000;
          auVar124._24_4_ =
               (uint)(bVar53 >> 6) * auVar84._24_4_ | (uint)!(bool)(bVar53 >> 6) * 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar84 = vshufps_avx(auVar124,auVar124,0xb1);
          auVar84 = vminps_avx(auVar124,auVar84);
          auVar85 = vshufpd_avx(auVar84,auVar84,5);
          auVar84 = vminps_avx(auVar84,auVar85);
          auVar85 = vpermpd_avx2(auVar84,0x4e);
          auVar84 = vminps_avx(auVar84,auVar85);
          uVar12 = vcmpps_avx512vl(auVar124,auVar84,0);
          bVar55 = (byte)uVar12 & bVar53;
          bVar47 = bVar53;
          if (bVar55 != 0) {
            bVar47 = bVar55;
          }
          iVar15 = 0;
          for (uVar59 = (uint)bVar47; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar47 = '\x01' << ((byte)iVar15 & 0x1f);
          uVar59 = *(uint *)(local_200 + (uint)(iVar15 << 2));
          uVar130 = *(uint *)(local_360 + (uint)(iVar15 << 2));
          fVar224 = auVar66._0_4_;
          if ((float)local_7e0._0_4_ < 0.0) {
            auVar258 = ZEXT1664(auVar258._0_16_);
            auVar264 = ZEXT1664(auVar264._0_16_);
            auVar266 = ZEXT1664(auVar266._0_16_);
            fVar224 = sqrtf((float)local_7e0._0_4_);
          }
          auVar253 = ZEXT464(uVar130);
          uVar58 = (ulong)bVar47;
          auVar67 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar60 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
          auVar72 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar61 = vminps_avx(auVar67,auVar72);
          auVar67 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
          auVar72 = vmaxps_avx(auVar60,auVar67);
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar60 = vandps_avx(auVar61,auVar208);
          auVar67 = vandps_avx(auVar72,auVar208);
          auVar60 = vmaxps_avx(auVar60,auVar67);
          auVar67 = vmovshdup_avx(auVar60);
          auVar67 = vmaxss_avx(auVar67,auVar60);
          auVar60 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vmaxss_avx(auVar60,auVar67);
          fVar197 = auVar60._0_4_ * 1.9073486e-06;
          local_6e0 = vshufps_avx(auVar72,auVar72,0xff);
          auVar60 = vinsertps_avx(ZEXT416(uVar130),ZEXT416(uVar59),0x10);
          uVar54 = 0;
          while( true ) {
            bVar55 = (byte)uVar58;
            if (uVar54 == 5) break;
            uVar157 = auVar60._0_4_;
            auVar144._4_4_ = uVar157;
            auVar144._0_4_ = uVar157;
            auVar144._8_4_ = uVar157;
            auVar144._12_4_ = uVar157;
            auVar67 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_7d0);
            auVar72 = vmovshdup_avx(auVar60);
            fVar245 = auVar72._0_4_;
            fVar223 = 1.0 - fVar245;
            fVar218 = fVar245 * fVar245;
            auVar69 = SUB6416(ZEXT464(0x40400000),0);
            auVar62 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar265 = vfmadd213ss_fma(auVar69,auVar72,auVar62);
            auVar61 = vfmadd213ss_fma(auVar265,ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x40000000),0)
                                     );
            auVar68 = vfmadd213ss_fma(auVar69,ZEXT416((uint)fVar223),auVar62);
            auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar223 * fVar223)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar219 = fVar223 * fVar223 * -fVar245 * 0.5;
            fVar220 = auVar61._0_4_ * 0.5;
            fVar221 = auVar68._0_4_ * 0.5;
            fVar222 = fVar245 * fVar245 * -fVar223 * 0.5;
            auVar209._0_4_ = fVar222 * (float)local_7c0._0_4_;
            auVar209._4_4_ = fVar222 * (float)local_7c0._4_4_;
            auVar209._8_4_ = fVar222 * fStack_7b8;
            auVar209._12_4_ = fVar222 * fStack_7b4;
            auVar228._4_4_ = fVar221;
            auVar228._0_4_ = fVar221;
            auVar228._8_4_ = fVar221;
            auVar228._12_4_ = fVar221;
            auVar61 = vfmadd132ps_fma(auVar228,auVar209,local_780._0_16_);
            auVar186._4_4_ = fVar220;
            auVar186._0_4_ = fVar220;
            auVar186._8_4_ = fVar220;
            auVar186._12_4_ = fVar220;
            auVar61 = vfmadd132ps_fma(auVar186,auVar61,local_7a0._0_16_);
            auVar210._4_4_ = fVar219;
            auVar210._0_4_ = fVar219;
            auVar210._8_4_ = fVar219;
            auVar210._12_4_ = fVar219;
            auVar61 = vfmadd132ps_fma(auVar210,auVar61,local_760._0_16_);
            auVar68 = vfmadd231ss_fma(auVar62,auVar72,ZEXT416(0x41100000));
            local_640._0_16_ = auVar68;
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar72,ZEXT416(0x40800000));
            local_660._0_16_ = auVar68;
            auVar68 = vfmadd213ss_fma(auVar69,auVar72,ZEXT416(0xbf800000));
            local_680._0_16_ = auVar68;
            _local_620 = auVar61;
            auVar61 = vsubps_avx(auVar67,auVar61);
            auVar67 = vdpps_avx(auVar61,auVar61,0x7f);
            fVar219 = auVar67._0_4_;
            local_740 = ZEXT1632(auVar60);
            if (fVar219 < 0.0) {
              local_800._0_4_ = fVar218;
              local_820._0_4_ = fVar223 * -2.0;
              auVar266._0_4_ = sqrtf(fVar219);
              auVar266._4_60_ = extraout_var_00;
              auVar265 = ZEXT416(auVar265._0_4_);
              auVar60 = auVar266._0_16_;
              uVar58 = extraout_RAX_02;
            }
            else {
              auVar60 = vsqrtss_avx(auVar67,auVar67);
              local_820._0_4_ = fVar223 * -2.0;
              local_800._0_4_ = fVar218;
            }
            auVar69 = vfnmadd231ss_fma(ZEXT416((uint)(fVar245 * (fVar223 + fVar223))),
                                       ZEXT416((uint)fVar223),ZEXT416((uint)fVar223));
            auVar265 = vfmadd213ss_fma(auVar265,ZEXT416((uint)(fVar245 + fVar245)),
                                       ZEXT416((uint)(fVar245 * fVar245 * 3.0)));
            auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar72,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                      ZEXT416((uint)(fVar223 + fVar223)),auVar68);
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar72,
                                      ZEXT416((uint)local_800._0_4_));
            fVar218 = auVar69._0_4_ * 0.5;
            fVar220 = auVar265._0_4_ * 0.5;
            fVar221 = auVar62._0_4_ * 0.5;
            fVar222 = auVar68._0_4_ * 0.5;
            auVar211._0_4_ = fVar222 * (float)local_7c0._0_4_;
            auVar211._4_4_ = fVar222 * (float)local_7c0._4_4_;
            auVar211._8_4_ = fVar222 * fStack_7b8;
            auVar211._12_4_ = fVar222 * fStack_7b4;
            auVar187._4_4_ = fVar221;
            auVar187._0_4_ = fVar221;
            auVar187._8_4_ = fVar221;
            auVar187._12_4_ = fVar221;
            auVar265 = vfmadd132ps_fma(auVar187,auVar211,local_780._0_16_);
            auVar165._4_4_ = fVar220;
            auVar165._0_4_ = fVar220;
            auVar165._8_4_ = fVar220;
            auVar165._12_4_ = fVar220;
            auVar265 = vfmadd132ps_fma(auVar165,auVar265,local_7a0._0_16_);
            auVar269._4_4_ = fVar218;
            auVar269._0_4_ = fVar218;
            auVar269._8_4_ = fVar218;
            auVar269._12_4_ = fVar218;
            auVar265 = vfmadd132ps_fma(auVar269,auVar265,local_760._0_16_);
            local_800._0_16_ = vdpps_avx(auVar265,auVar265,0x7f);
            auVar42._12_4_ = 0;
            auVar42._0_12_ = ZEXT812(0);
            fVar218 = local_800._0_4_;
            auVar68 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar218));
            fVar220 = auVar68._0_4_;
            local_820._0_16_ = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar218));
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar62 = vxorps_avx512vl(local_800._0_16_,auVar21);
            auVar68 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            local_6a0._0_4_ = auVar68._0_4_;
            uVar59 = auVar60._0_4_;
            if (fVar218 < auVar62._0_4_) {
              fVar221 = sqrtf(fVar218);
              auVar60 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_03;
            }
            else {
              auVar68 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
              fVar221 = auVar68._0_4_;
            }
            fVar218 = fVar220 * 1.5 + fVar218 * -0.5 * fVar220 * fVar220 * fVar220;
            auVar145._0_4_ = auVar265._0_4_ * fVar218;
            auVar145._4_4_ = auVar265._4_4_ * fVar218;
            auVar145._8_4_ = auVar265._8_4_ * fVar218;
            auVar145._12_4_ = auVar265._12_4_ * fVar218;
            auVar68 = vdpps_avx(auVar61,auVar145,0x7f);
            fVar223 = auVar60._0_4_;
            fVar220 = auVar68._0_4_;
            auVar146._0_4_ = fVar220 * fVar220;
            auVar146._4_4_ = auVar68._4_4_ * auVar68._4_4_;
            auVar146._8_4_ = auVar68._8_4_ * auVar68._8_4_;
            auVar146._12_4_ = auVar68._12_4_ * auVar68._12_4_;
            auVar62 = vsubps_avx512vl(auVar67,auVar146);
            fVar222 = auVar62._0_4_;
            auVar166._4_12_ = ZEXT812(0) << 0x20;
            auVar166._0_4_ = fVar222;
            auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
            auVar70 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
            if (fVar222 < 0.0) {
              local_6d0 = fVar218;
              fStack_6cc = fVar218;
              fStack_6c8 = fVar218;
              fStack_6c4 = fVar218;
              local_6c0 = auVar69;
              fVar222 = sqrtf(fVar222);
              auVar70 = ZEXT416(auVar70._0_4_);
              auVar60 = ZEXT416(uVar59);
              uVar58 = extraout_RAX_04;
              auVar62 = local_6c0;
              fVar218 = local_6d0;
              fVar245 = fStack_6cc;
              fVar246 = fStack_6c8;
              fVar247 = fStack_6c4;
            }
            else {
              auVar62 = vsqrtss_avx(auVar62,auVar62);
              fVar222 = auVar62._0_4_;
              auVar62 = auVar69;
              fVar245 = fVar218;
              fVar246 = fVar218;
              fVar247 = fVar218;
            }
            auVar264 = ZEXT1664(auVar61);
            auVar167._0_4_ = (float)local_680._0_4_ * (float)local_7c0._0_4_;
            auVar167._4_4_ = (float)local_680._0_4_ * (float)local_7c0._4_4_;
            auVar167._8_4_ = (float)local_680._0_4_ * fStack_7b8;
            auVar167._12_4_ = (float)local_680._0_4_ * fStack_7b4;
            auVar188._4_4_ = local_660._0_4_;
            auVar188._0_4_ = local_660._0_4_;
            auVar188._8_4_ = local_660._0_4_;
            auVar188._12_4_ = local_660._0_4_;
            auVar64 = vfmadd132ps_fma(auVar188,auVar167,local_780._0_16_);
            auVar168._4_4_ = local_640._0_4_;
            auVar168._0_4_ = local_640._0_4_;
            auVar168._8_4_ = local_640._0_4_;
            auVar168._12_4_ = local_640._0_4_;
            auVar64 = vfmadd132ps_fma(auVar168,auVar64,local_7a0._0_16_);
            auVar72 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar157 = auVar72._0_4_;
            auVar189._4_4_ = uVar157;
            auVar189._0_4_ = uVar157;
            auVar189._8_4_ = uVar157;
            auVar189._12_4_ = uVar157;
            auVar72 = vfmadd132ps_fma(auVar189,auVar64,local_760._0_16_);
            auVar169._0_4_ = auVar72._0_4_ * (float)local_800._0_4_;
            auVar169._4_4_ = auVar72._4_4_ * (float)local_800._0_4_;
            auVar169._8_4_ = auVar72._8_4_ * (float)local_800._0_4_;
            auVar169._12_4_ = auVar72._12_4_ * (float)local_800._0_4_;
            auVar72 = vdpps_avx(auVar265,auVar72,0x7f);
            fVar176 = auVar72._0_4_;
            auVar190._0_4_ = auVar265._0_4_ * fVar176;
            auVar190._4_4_ = auVar265._4_4_ * fVar176;
            auVar190._8_4_ = auVar265._8_4_ * fVar176;
            auVar190._12_4_ = auVar265._12_4_ * fVar176;
            auVar72 = vsubps_avx(auVar169,auVar190);
            fVar176 = (float)local_6a0._0_4_ * (float)local_820._0_4_;
            auVar64 = vmaxss_avx(ZEXT416((uint)fVar197),
                                 ZEXT416((uint)(local_740._0_4_ * fVar224 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar71 = vxorps_avx512vl(auVar265,auVar22);
            auVar191._0_4_ = fVar218 * auVar72._0_4_ * fVar176;
            auVar191._4_4_ = fVar245 * auVar72._4_4_ * fVar176;
            auVar191._8_4_ = fVar246 * auVar72._8_4_ * fVar176;
            auVar191._12_4_ = fVar247 * auVar72._12_4_ * fVar176;
            auVar266 = ZEXT1664(auVar145);
            auVar72 = vdpps_avx(auVar71,auVar145,0x7f);
            auVar63 = vfmadd213ss_fma(auVar60,ZEXT416((uint)fVar197),auVar64);
            auVar60 = vdpps_avx(auVar61,auVar191,0x7f);
            auVar63 = vfmadd213ss_fma(ZEXT416((uint)(fVar223 + 1.0)),
                                      ZEXT416((uint)(fVar197 / fVar221)),auVar63);
            fVar218 = auVar72._0_4_ + auVar60._0_4_;
            auVar60 = vdpps_avx(local_7d0,auVar145,0x7f);
            auVar72 = vdpps_avx(auVar61,auVar71,0x7f);
            auVar70 = vmulss_avx512f(auVar70,auVar62);
            fVar221 = auVar69._0_4_ * 1.5 + auVar70._0_4_ * auVar62._0_4_ * auVar62._0_4_;
            auVar62 = vdpps_avx(auVar61,local_7d0,0x7f);
            auVar70 = vfnmadd231ss_fma(auVar72,auVar68,ZEXT416((uint)fVar218));
            auVar62 = vfnmadd231ss_fma(auVar62,auVar68,auVar60);
            auVar72 = vpermilps_avx(_local_620,0xff);
            fVar222 = fVar222 - auVar72._0_4_;
            auVar69 = vshufps_avx(auVar265,auVar265,0xff);
            auVar72 = vfmsub213ss_fma(auVar70,ZEXT416((uint)fVar221),auVar69);
            auVar256._8_4_ = 0x80000000;
            auVar256._0_8_ = 0x8000000080000000;
            auVar256._12_4_ = 0x80000000;
            auVar258 = ZEXT1664(auVar256);
            auVar251._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar251._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar251._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar253 = ZEXT1664(auVar251);
            auVar62 = ZEXT416((uint)(auVar62._0_4_ * fVar221));
            auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar72._0_4_)),
                                      ZEXT416((uint)fVar218),auVar62);
            auVar72 = vinsertps_avx(auVar251,auVar62,0x1c);
            auVar235._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar235._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar235._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar62 = vinsertps_avx(ZEXT416((uint)fVar218),auVar235,0x10);
            auVar212._0_4_ = auVar70._0_4_;
            auVar212._4_4_ = auVar212._0_4_;
            auVar212._8_4_ = auVar212._0_4_;
            auVar212._12_4_ = auVar212._0_4_;
            auVar60 = vdivps_avx(auVar72,auVar212);
            auVar72 = vdivps_avx(auVar62,auVar212);
            auVar213._0_4_ = fVar220 * auVar60._0_4_ + fVar222 * auVar72._0_4_;
            auVar213._4_4_ = fVar220 * auVar60._4_4_ + fVar222 * auVar72._4_4_;
            auVar213._8_4_ = fVar220 * auVar60._8_4_ + fVar222 * auVar72._8_4_;
            auVar213._12_4_ = fVar220 * auVar60._12_4_ + fVar222 * auVar72._12_4_;
            auVar60 = vsubps_avx(local_740._0_16_,auVar213);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar72 = vandps_avx512vl(auVar68,auVar23);
            if (auVar72._0_4_ < auVar63._0_4_) {
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ + auVar64._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar68 = vandps_avx512vl(ZEXT416((uint)fVar222),auVar24);
              if (auVar68._0_4_ < auVar72._0_4_) {
                bVar57 = uVar54 < 5;
                fVar224 = auVar60._0_4_ + (float)local_6f0._0_4_;
                if ((fVar156 <= fVar224) &&
                   (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar224 <= fVar197)) {
                  auVar72 = vmovshdup_avx(auVar60);
                  bVar55 = 0;
                  if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_017f7883;
                  auVar214._0_12_ = ZEXT812(0);
                  auVar214._12_4_ = 0;
                  auVar126._16_16_ = auVar123._16_16_;
                  auVar126._0_16_ = auVar214;
                  auVar125._4_28_ = auVar126._4_28_;
                  auVar125._0_4_ = fVar219;
                  auVar72 = vrsqrt14ss_avx512f(auVar214,auVar125._0_16_);
                  fVar218 = auVar72._0_4_;
                  auVar67 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
                  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar55 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_017f7883;
                    fVar218 = fVar218 * 1.5 + auVar67._0_4_ * fVar218 * fVar218 * fVar218;
                    auVar192._0_4_ = auVar61._0_4_ * fVar218;
                    auVar192._4_4_ = auVar61._4_4_ * fVar218;
                    auVar192._8_4_ = auVar61._8_4_ * fVar218;
                    auVar192._12_4_ = auVar61._12_4_ * fVar218;
                    auVar68 = vfmadd213ps_fma(auVar69,auVar192,auVar265);
                    auVar67 = vshufps_avx(auVar192,auVar192,0xc9);
                    auVar72 = vshufps_avx(auVar265,auVar265,0xc9);
                    auVar193._0_4_ = auVar192._0_4_ * auVar72._0_4_;
                    auVar193._4_4_ = auVar192._4_4_ * auVar72._4_4_;
                    auVar193._8_4_ = auVar192._8_4_ * auVar72._8_4_;
                    auVar193._12_4_ = auVar192._12_4_ * auVar72._12_4_;
                    auVar265 = vfmsub231ps_fma(auVar193,auVar265,auVar67);
                    auVar67 = vshufps_avx(auVar265,auVar265,0xc9);
                    auVar72 = vshufps_avx(auVar68,auVar68,0xc9);
                    auVar265 = vshufps_avx(auVar265,auVar265,0xd2);
                    auVar147._0_4_ = auVar68._0_4_ * auVar265._0_4_;
                    auVar147._4_4_ = auVar68._4_4_ * auVar265._4_4_;
                    auVar147._8_4_ = auVar68._8_4_ * auVar265._8_4_;
                    auVar147._12_4_ = auVar68._12_4_ * auVar265._12_4_;
                    auVar67 = vfmsub231ps_fma(auVar147,auVar67,auVar72);
                    auVar216._8_4_ = 1;
                    auVar216._0_8_ = 0x100000001;
                    auVar216._12_4_ = 1;
                    auVar216._16_4_ = 1;
                    auVar216._20_4_ = 1;
                    auVar216._24_4_ = 1;
                    auVar216._28_4_ = 1;
                    local_440 = vpermps_avx2(auVar216,ZEXT1632(auVar60));
                    auVar84 = vpermps_avx2(auVar216,ZEXT1632(auVar67));
                    auVar231._8_4_ = 2;
                    auVar231._0_8_ = 0x200000002;
                    auVar231._12_4_ = 2;
                    auVar231._16_4_ = 2;
                    auVar231._20_4_ = 2;
                    auVar231._24_4_ = 2;
                    auVar231._28_4_ = 2;
                    local_480 = vpermps_avx2(auVar231,ZEXT1632(auVar67));
                    local_460 = auVar67._0_4_;
                    local_4a0[0] = (RTCHitN)auVar84[0];
                    local_4a0[1] = (RTCHitN)auVar84[1];
                    local_4a0[2] = (RTCHitN)auVar84[2];
                    local_4a0[3] = (RTCHitN)auVar84[3];
                    local_4a0[4] = (RTCHitN)auVar84[4];
                    local_4a0[5] = (RTCHitN)auVar84[5];
                    local_4a0[6] = (RTCHitN)auVar84[6];
                    local_4a0[7] = (RTCHitN)auVar84[7];
                    local_4a0[8] = (RTCHitN)auVar84[8];
                    local_4a0[9] = (RTCHitN)auVar84[9];
                    local_4a0[10] = (RTCHitN)auVar84[10];
                    local_4a0[0xb] = (RTCHitN)auVar84[0xb];
                    local_4a0[0xc] = (RTCHitN)auVar84[0xc];
                    local_4a0[0xd] = (RTCHitN)auVar84[0xd];
                    local_4a0[0xe] = (RTCHitN)auVar84[0xe];
                    local_4a0[0xf] = (RTCHitN)auVar84[0xf];
                    local_4a0[0x10] = (RTCHitN)auVar84[0x10];
                    local_4a0[0x11] = (RTCHitN)auVar84[0x11];
                    local_4a0[0x12] = (RTCHitN)auVar84[0x12];
                    local_4a0[0x13] = (RTCHitN)auVar84[0x13];
                    local_4a0[0x14] = (RTCHitN)auVar84[0x14];
                    local_4a0[0x15] = (RTCHitN)auVar84[0x15];
                    local_4a0[0x16] = (RTCHitN)auVar84[0x16];
                    local_4a0[0x17] = (RTCHitN)auVar84[0x17];
                    local_4a0[0x18] = (RTCHitN)auVar84[0x18];
                    local_4a0[0x19] = (RTCHitN)auVar84[0x19];
                    local_4a0[0x1a] = (RTCHitN)auVar84[0x1a];
                    local_4a0[0x1b] = (RTCHitN)auVar84[0x1b];
                    local_4a0[0x1c] = (RTCHitN)auVar84[0x1c];
                    local_4a0[0x1d] = (RTCHitN)auVar84[0x1d];
                    local_4a0[0x1e] = (RTCHitN)auVar84[0x1e];
                    local_4a0[0x1f] = (RTCHitN)auVar84[0x1f];
                    uStack_45c = local_460;
                    uStack_458 = local_460;
                    uStack_454 = local_460;
                    uStack_450 = local_460;
                    uStack_44c = local_460;
                    uStack_448 = local_460;
                    uStack_444 = local_460;
                    local_420 = ZEXT432(0) << 0x20;
                    local_400 = local_4c0._0_8_;
                    uStack_3f8 = local_4c0._8_8_;
                    uStack_3f0 = local_4c0._16_8_;
                    uStack_3e8 = local_4c0._24_8_;
                    local_3e0 = local_4e0;
                    vpcmpeqd_avx2(local_4e0,local_4e0);
                    local_3c0 = context->user->instID[0];
                    uStack_3bc = local_3c0;
                    uStack_3b8 = local_3c0;
                    uStack_3b4 = local_3c0;
                    uStack_3b0 = local_3c0;
                    uStack_3ac = local_3c0;
                    uStack_3a8 = local_3c0;
                    uStack_3a4 = local_3c0;
                    local_3a0 = context->user->instPrimID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    *(float *)(ray + k * 4 + 0x100) = fVar224;
                    local_720 = local_520;
                    local_850.valid = (int *)local_720;
                    local_850.geometryUserPtr = pGVar2->userPtr;
                    local_850.context = context->user;
                    local_850.hit = local_4a0;
                    local_850.N = 8;
                    local_850.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar251);
                      auVar258 = ZEXT1664(auVar256);
                      auVar264 = ZEXT1664(auVar61);
                      auVar266 = ZEXT1664(auVar145);
                      (*pGVar2->occlusionFilterN)(&local_850);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        (*p_Var3)(&local_850);
                      }
                      uVar58 = vptestmd_avx512vl(local_720,local_720);
                      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar4 = (bool)((byte)uVar58 & 1);
                      auVar127._0_4_ =
                           (uint)bVar4 * auVar84._0_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x100);
                      bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                      auVar127._4_4_ =
                           (uint)bVar4 * auVar84._4_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x104);
                      bVar4 = (bool)((byte)(uVar58 >> 2) & 1);
                      auVar127._8_4_ =
                           (uint)bVar4 * auVar84._8_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x108);
                      bVar4 = (bool)((byte)(uVar58 >> 3) & 1);
                      auVar127._12_4_ =
                           (uint)bVar4 * auVar84._12_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x10c);
                      bVar4 = (bool)((byte)(uVar58 >> 4) & 1);
                      auVar127._16_4_ =
                           (uint)bVar4 * auVar84._16_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x110);
                      bVar4 = (bool)((byte)(uVar58 >> 5) & 1);
                      auVar127._20_4_ =
                           (uint)bVar4 * auVar84._20_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x114);
                      bVar4 = (bool)((byte)(uVar58 >> 6) & 1);
                      auVar127._24_4_ =
                           (uint)bVar4 * auVar84._24_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x118);
                      bVar4 = SUB81(uVar58 >> 7,0);
                      auVar127._28_4_ =
                           (uint)bVar4 * auVar84._28_4_ |
                           (uint)!bVar4 * *(int *)(local_850.ray + 0x11c);
                      *(undefined1 (*) [32])(local_850.ray + 0x100) = auVar127;
                      bVar55 = 1;
                      if (local_720 != (undefined1  [32])0x0) goto LAB_017f7883;
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                  }
                }
                bVar55 = 0;
                goto LAB_017f7883;
              }
            }
            uVar54 = uVar54 + 1;
          }
          bVar57 = false;
LAB_017f7883:
          bVar49 = bVar49 | bVar57 & bVar55;
          uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar237._4_4_ = uVar157;
          auVar237._0_4_ = uVar157;
          auVar237._8_4_ = uVar157;
          auVar237._12_4_ = uVar157;
          auVar237._16_4_ = uVar157;
          auVar237._20_4_ = uVar157;
          auVar237._24_4_ = uVar157;
          auVar237._28_4_ = uVar157;
          auVar175 = ZEXT3264(auVar237);
          auVar44._4_4_ = fStack_55c;
          auVar44._0_4_ = local_560;
          auVar44._8_4_ = fStack_558;
          auVar44._12_4_ = fStack_554;
          auVar44._16_4_ = fStack_550;
          auVar44._20_4_ = fStack_54c;
          auVar44._24_4_ = fStack_548;
          auVar44._28_4_ = fStack_544;
          uVar12 = vcmpps_avx512vl(auVar237,auVar44,0xd);
        }
        uVar14 = vpcmpd_avx512vl(local_500,local_340,1);
        uVar13 = vpcmpd_avx512vl(local_500,_local_580,1);
        auVar172._0_4_ = (float)local_5a0._0_4_ + (float)local_1c0._0_4_;
        auVar172._4_4_ = (float)local_5a0._4_4_ + (float)local_1c0._4_4_;
        auVar172._8_4_ = fStack_598 + fStack_1b8;
        auVar172._12_4_ = fStack_594 + fStack_1b4;
        auVar172._16_4_ = fStack_590 + fStack_1b0;
        auVar172._20_4_ = fStack_58c + fStack_1ac;
        auVar172._24_4_ = fStack_588 + fStack_1a8;
        auVar172._28_4_ = fStack_584 + fStack_1a4;
        uVar157 = auVar175._0_4_;
        auVar195._4_4_ = uVar157;
        auVar195._0_4_ = uVar157;
        auVar195._8_4_ = uVar157;
        auVar195._12_4_ = uVar157;
        auVar195._16_4_ = uVar157;
        auVar195._20_4_ = uVar157;
        auVar195._24_4_ = uVar157;
        auVar195._28_4_ = uVar157;
        uVar12 = vcmpps_avx512vl(auVar172,auVar195,2);
        bVar52 = bVar52 & (byte)uVar14 & (byte)uVar12;
        auVar217._0_4_ = (float)local_5a0._0_4_ + (float)local_380._0_4_;
        auVar217._4_4_ = (float)local_5a0._4_4_ + (float)local_380._4_4_;
        auVar217._8_4_ = fStack_598 + fStack_378;
        auVar217._12_4_ = fStack_594 + fStack_374;
        auVar217._16_4_ = fStack_590 + fStack_370;
        auVar217._20_4_ = fStack_58c + fStack_36c;
        auVar217._24_4_ = fStack_588 + fStack_368;
        auVar217._28_4_ = fStack_584 + fStack_364;
        uVar12 = vcmpps_avx512vl(auVar217,auVar195,2);
        bVar46 = bVar46 & (byte)uVar13 & (byte)uVar12 | bVar52;
        if (bVar46 != 0) {
          abStack_180[uVar50 * 0x60] = bVar46;
          auVar128._0_4_ =
               (uint)(bVar52 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar52 & 1) * local_380._0_4_;
          bVar57 = (bool)(bVar52 >> 1 & 1);
          auVar128._4_4_ = (uint)bVar57 * local_1c0._4_4_ | (uint)!bVar57 * local_380._4_4_;
          bVar57 = (bool)(bVar52 >> 2 & 1);
          auVar128._8_4_ = (uint)bVar57 * (int)fStack_1b8 | (uint)!bVar57 * (int)fStack_378;
          bVar57 = (bool)(bVar52 >> 3 & 1);
          auVar128._12_4_ = (uint)bVar57 * (int)fStack_1b4 | (uint)!bVar57 * (int)fStack_374;
          bVar57 = (bool)(bVar52 >> 4 & 1);
          auVar128._16_4_ = (uint)bVar57 * (int)fStack_1b0 | (uint)!bVar57 * (int)fStack_370;
          bVar57 = (bool)(bVar52 >> 5 & 1);
          auVar128._20_4_ = (uint)bVar57 * (int)fStack_1ac | (uint)!bVar57 * (int)fStack_36c;
          auVar128._24_4_ =
               (uint)(bVar52 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar52 >> 6) * (int)fStack_368;
          auVar128._28_4_ = fStack_364;
          *(undefined1 (*) [32])(auStack_160 + uVar50 * 0x60) = auVar128;
          uVar58 = vmovlps_avx(local_530);
          (&uStack_140)[uVar50 * 0xc] = uVar58;
          aiStack_138[uVar50 * 0x18] = local_ae8 + 1;
          uVar50 = (ulong)((int)uVar50 + 1);
        }
      }
      auVar238 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar59 = (uint)uVar50;
      uVar50 = (ulong)(uVar59 - 1);
      if (uVar59 == 0) {
        if (bVar49 != 0) goto LAB_017f7e58;
        uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar25._4_4_ = uVar157;
        auVar25._0_4_ = uVar157;
        auVar25._8_4_ = uVar157;
        auVar25._12_4_ = uVar157;
        uVar12 = vcmpps_avx512vl(local_540,auVar25,2);
        uVar56 = (ulong)((uint)local_6a8 & (uint)uVar12);
        goto LAB_017f5489;
      }
      lVar51 = uVar50 * 0x60;
      auVar83 = *(undefined1 (*) [32])(auStack_160 + lVar51);
      auVar173._0_4_ = auVar83._0_4_ + (float)local_5a0._0_4_;
      auVar173._4_4_ = auVar83._4_4_ + (float)local_5a0._4_4_;
      auVar173._8_4_ = auVar83._8_4_ + fStack_598;
      auVar173._12_4_ = auVar83._12_4_ + fStack_594;
      auVar173._16_4_ = auVar83._16_4_ + fStack_590;
      auVar173._20_4_ = auVar83._20_4_ + fStack_58c;
      auVar173._24_4_ = auVar83._24_4_ + fStack_588;
      auVar173._28_4_ = auVar83._28_4_ + fStack_584;
      uVar157 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar157;
      auVar29._0_4_ = uVar157;
      auVar29._8_4_ = uVar157;
      auVar29._12_4_ = uVar157;
      auVar29._16_4_ = uVar157;
      auVar29._20_4_ = uVar157;
      auVar29._24_4_ = uVar157;
      auVar29._28_4_ = uVar157;
      uVar12 = vcmpps_avx512vl(auVar173,auVar29,2);
      uVar130 = (uint)uVar12 & (uint)abStack_180[lVar51];
    } while (uVar130 == 0);
    uVar58 = (&uStack_140)[uVar50 * 0xc];
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar58;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar196,auVar83);
    bVar46 = (byte)uVar130;
    auVar129._0_4_ =
         (uint)(bVar46 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar46 & 1) * (int)auVar83._0_4_;
    bVar57 = (bool)((byte)(uVar130 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar57 * auVar84._4_4_ | (uint)!bVar57 * (int)auVar83._4_4_;
    bVar57 = (bool)((byte)(uVar130 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar57 * auVar84._8_4_ | (uint)!bVar57 * (int)auVar83._8_4_;
    bVar57 = (bool)((byte)(uVar130 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar57 * auVar84._12_4_ | (uint)!bVar57 * (int)auVar83._12_4_;
    bVar57 = (bool)((byte)(uVar130 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar57 * auVar84._16_4_ | (uint)!bVar57 * (int)auVar83._16_4_;
    bVar57 = (bool)((byte)(uVar130 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar57 * auVar84._20_4_ | (uint)!bVar57 * (int)auVar83._20_4_;
    bVar57 = (bool)((byte)(uVar130 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar57 * auVar84._24_4_ | (uint)!bVar57 * (int)auVar83._24_4_;
    auVar129._28_4_ =
         (uVar130 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar130 >> 7,0) * (int)auVar83._28_4_;
    auVar83 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar83 = vminps_avx(auVar129,auVar83);
    auVar84 = vshufpd_avx(auVar83,auVar83,5);
    auVar83 = vminps_avx(auVar83,auVar84);
    auVar84 = vpermpd_avx2(auVar83,0x4e);
    auVar83 = vminps_avx(auVar83,auVar84);
    uVar12 = vcmpps_avx512vl(auVar129,auVar83,0);
    bVar53 = (byte)uVar12 & bVar46;
    if (bVar53 != 0) {
      uVar130 = (uint)bVar53;
    }
    uVar131 = 0;
    for (; (uVar130 & 1) == 0; uVar130 = uVar130 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    local_ae8 = aiStack_138[uVar50 * 0x18];
    bVar46 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar46;
    abStack_180[lVar51] = bVar46;
    if (bVar46 == 0) {
      uVar59 = uVar59 - 1;
    }
    uVar157 = (undefined4)uVar58;
    auVar155._4_4_ = uVar157;
    auVar155._0_4_ = uVar157;
    auVar155._8_4_ = uVar157;
    auVar155._12_4_ = uVar157;
    auVar155._16_4_ = uVar157;
    auVar155._20_4_ = uVar157;
    auVar155._24_4_ = uVar157;
    auVar155._28_4_ = uVar157;
    auVar60 = vmovshdup_avx(auVar170);
    auVar60 = vsubps_avx(auVar60,auVar170);
    auVar174._0_4_ = auVar60._0_4_;
    auVar174._4_4_ = auVar174._0_4_;
    auVar174._8_4_ = auVar174._0_4_;
    auVar174._12_4_ = auVar174._0_4_;
    auVar174._16_4_ = auVar174._0_4_;
    auVar174._20_4_ = auVar174._0_4_;
    auVar174._24_4_ = auVar174._0_4_;
    auVar174._28_4_ = auVar174._0_4_;
    auVar60 = vfmadd132ps_fma(auVar174,auVar155,auVar238._0_32_);
    auVar83 = ZEXT1632(auVar60);
    local_4a0[0] = (RTCHitN)auVar83[0];
    local_4a0[1] = (RTCHitN)auVar83[1];
    local_4a0[2] = (RTCHitN)auVar83[2];
    local_4a0[3] = (RTCHitN)auVar83[3];
    local_4a0[4] = (RTCHitN)auVar83[4];
    local_4a0[5] = (RTCHitN)auVar83[5];
    local_4a0[6] = (RTCHitN)auVar83[6];
    local_4a0[7] = (RTCHitN)auVar83[7];
    local_4a0[8] = (RTCHitN)auVar83[8];
    local_4a0[9] = (RTCHitN)auVar83[9];
    local_4a0[10] = (RTCHitN)auVar83[10];
    local_4a0[0xb] = (RTCHitN)auVar83[0xb];
    local_4a0[0xc] = (RTCHitN)auVar83[0xc];
    local_4a0[0xd] = (RTCHitN)auVar83[0xd];
    local_4a0[0xe] = (RTCHitN)auVar83[0xe];
    local_4a0[0xf] = (RTCHitN)auVar83[0xf];
    local_4a0[0x10] = (RTCHitN)auVar83[0x10];
    local_4a0[0x11] = (RTCHitN)auVar83[0x11];
    local_4a0[0x12] = (RTCHitN)auVar83[0x12];
    local_4a0[0x13] = (RTCHitN)auVar83[0x13];
    local_4a0[0x14] = (RTCHitN)auVar83[0x14];
    local_4a0[0x15] = (RTCHitN)auVar83[0x15];
    local_4a0[0x16] = (RTCHitN)auVar83[0x16];
    local_4a0[0x17] = (RTCHitN)auVar83[0x17];
    local_4a0[0x18] = (RTCHitN)auVar83[0x18];
    local_4a0[0x19] = (RTCHitN)auVar83[0x19];
    local_4a0[0x1a] = (RTCHitN)auVar83[0x1a];
    local_4a0[0x1b] = (RTCHitN)auVar83[0x1b];
    local_4a0[0x1c] = (RTCHitN)auVar83[0x1c];
    local_4a0[0x1d] = (RTCHitN)auVar83[0x1d];
    local_4a0[0x1e] = (RTCHitN)auVar83[0x1e];
    local_4a0[0x1f] = (RTCHitN)auVar83[0x1f];
    auVar175 = ZEXT864(*(ulong *)(local_4a0 + (ulong)uVar131 * 4));
    uVar50 = (ulong)uVar59;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }